

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  int iVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  byte bVar65;
  ulong uVar66;
  uint uVar67;
  long lVar68;
  Geometry *pGVar69;
  long lVar70;
  undefined8 unaff_R13;
  ulong uVar71;
  ulong uVar72;
  uint uVar73;
  byte bVar74;
  ulong uVar75;
  float fVar76;
  float fVar77;
  float fVar132;
  float fVar134;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar88 [16];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined4 uVar140;
  float fVar151;
  float fVar152;
  vint4 bi_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar153;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 bi_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar165;
  float fVar182;
  vint4 ai_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  vint4 ai;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [64];
  vint4 ai_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [64];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5d0 [16];
  Precalculations *local_5b8;
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  LinearSpace3fa *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  int local_410;
  int iStack_40c;
  int iStack_408;
  int iStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar66 = (ulong)(byte)prim[1];
  fVar157 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar83 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar166._0_4_ = fVar157 * auVar83._0_4_;
  auVar166._4_4_ = fVar157 * auVar83._4_4_;
  auVar166._8_4_ = fVar157 * auVar83._8_4_;
  auVar166._12_4_ = fVar157 * auVar83._12_4_;
  auVar141._0_4_ = fVar157 * auVar82._0_4_;
  auVar141._4_4_ = fVar157 * auVar82._4_4_;
  auVar141._8_4_ = fVar157 * auVar82._8_4_;
  auVar141._12_4_ = fVar157 * auVar82._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xc + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xd + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x12 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x13 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x14 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar210._4_4_ = auVar141._0_4_;
  auVar210._0_4_ = auVar141._0_4_;
  auVar210._8_4_ = auVar141._0_4_;
  auVar210._12_4_ = auVar141._0_4_;
  auVar22 = vshufps_avx(auVar141,auVar141,0x55);
  auVar87 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar157 = auVar87._0_4_;
  auVar183._0_4_ = fVar157 * auVar78._0_4_;
  fVar151 = auVar87._4_4_;
  auVar183._4_4_ = fVar151 * auVar78._4_4_;
  fVar152 = auVar87._8_4_;
  auVar183._8_4_ = fVar152 * auVar78._8_4_;
  fVar153 = auVar87._12_4_;
  auVar183._12_4_ = fVar153 * auVar78._12_4_;
  auVar154._0_4_ = auVar79._0_4_ * fVar157;
  auVar154._4_4_ = auVar79._4_4_ * fVar151;
  auVar154._8_4_ = auVar79._8_4_ * fVar152;
  auVar154._12_4_ = auVar79._12_4_ * fVar153;
  auVar85._0_4_ = auVar80._0_4_ * fVar157;
  auVar85._4_4_ = auVar80._4_4_ * fVar151;
  auVar85._8_4_ = auVar80._8_4_ * fVar152;
  auVar85._12_4_ = auVar80._12_4_ * fVar153;
  auVar87 = vfmadd231ps_fma(auVar183,auVar22,auVar82);
  auVar84 = vfmadd231ps_fma(auVar154,auVar22,auVar19);
  auVar22 = vfmadd231ps_fma(auVar85,auVar21,auVar22);
  auVar81 = vfmadd231ps_fma(auVar87,auVar210,auVar83);
  auVar84 = vfmadd231ps_fma(auVar84,auVar210,auVar18);
  auVar141 = vfmadd231ps_fma(auVar22,auVar20,auVar210);
  auVar211._4_4_ = auVar166._0_4_;
  auVar211._0_4_ = auVar166._0_4_;
  auVar211._8_4_ = auVar166._0_4_;
  auVar211._12_4_ = auVar166._0_4_;
  auVar22 = vshufps_avx(auVar166,auVar166,0x55);
  auVar87 = vshufps_avx(auVar166,auVar166,0xaa);
  auVar78 = vmulps_avx512vl(auVar87,auVar78);
  auVar167._0_4_ = auVar87._0_4_ * auVar79._0_4_;
  auVar167._4_4_ = auVar87._4_4_ * auVar79._4_4_;
  auVar167._8_4_ = auVar87._8_4_ * auVar79._8_4_;
  auVar167._12_4_ = auVar87._12_4_ * auVar79._12_4_;
  auVar158._0_4_ = auVar87._0_4_ * auVar80._0_4_;
  auVar158._4_4_ = auVar87._4_4_ * auVar80._4_4_;
  auVar158._8_4_ = auVar87._8_4_ * auVar80._8_4_;
  auVar158._12_4_ = auVar87._12_4_ * auVar80._12_4_;
  auVar79 = vfmadd231ps_avx512vl(auVar78,auVar22,auVar82);
  auVar82 = vfmadd231ps_fma(auVar167,auVar22,auVar19);
  auVar78 = vfmadd231ps_fma(auVar158,auVar22,auVar21);
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar211,auVar83);
  auVar19 = vfmadd231ps_fma(auVar82,auVar211,auVar18);
  auVar21 = vfmadd231ps_fma(auVar78,auVar211,auVar20);
  auVar199._8_4_ = 0x7fffffff;
  auVar199._0_8_ = 0x7fffffff7fffffff;
  auVar199._12_4_ = 0x7fffffff;
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  auVar83 = vandps_avx(auVar81,auVar199);
  uVar71 = vcmpps_avx512vl(auVar83,auVar190,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar87._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._12_4_;
  auVar83 = vandps_avx(auVar84,auVar199);
  uVar71 = vcmpps_avx512vl(auVar83,auVar190,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar81._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._12_4_;
  auVar83 = vandps_avx(auVar141,auVar199);
  uVar71 = vcmpps_avx512vl(auVar83,auVar190,1);
  bVar12 = (bool)((byte)uVar71 & 1);
  auVar84._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar141._0_4_;
  bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar141._4_4_;
  bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar141._8_4_;
  bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar141._12_4_;
  auVar82 = vrcp14ps_avx512vl(auVar87);
  auVar197._8_4_ = 0x3f800000;
  auVar197._0_8_ = 0x3f8000003f800000;
  auVar197._12_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar87,auVar82,auVar197);
  auVar78 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar81);
  auVar83 = vfnmadd213ps_fma(auVar81,auVar82,auVar197);
  auVar79 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar84);
  auVar83 = vfnmadd213ps_fma(auVar84,auVar82,auVar197);
  auVar20 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx512vl(auVar83,auVar80);
  auVar191._0_4_ = auVar78._0_4_ * auVar83._0_4_;
  auVar191._4_4_ = auVar78._4_4_ * auVar83._4_4_;
  auVar191._8_4_ = auVar78._8_4_ * auVar83._8_4_;
  auVar191._12_4_ = auVar78._12_4_ * auVar83._12_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar83 = vpmovsxwd_avx(auVar82);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx512vl(auVar83,auVar80);
  auVar184._0_4_ = auVar78._0_4_ * auVar83._0_4_;
  auVar184._4_4_ = auVar78._4_4_ * auVar83._4_4_;
  auVar184._8_4_ = auVar78._8_4_ * auVar83._8_4_;
  auVar184._12_4_ = auVar78._12_4_ * auVar83._12_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar66 * 0xe + 6);
  auVar83 = vpmovsxwd_avx(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar19);
  auVar198._0_4_ = auVar79._0_4_ * auVar83._0_4_;
  auVar198._4_4_ = auVar79._4_4_ * auVar83._4_4_;
  auVar198._8_4_ = auVar79._8_4_ * auVar83._8_4_;
  auVar198._12_4_ = auVar79._12_4_ * auVar83._12_4_;
  auVar78 = vpbroadcastd_avx512vl();
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar83 = vpmovsxwd_avx(auVar18);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82 = vsubps_avx(auVar83,auVar19);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar66 * 0x15 + 6);
  auVar83 = vpmovsxwd_avx(auVar19);
  auVar88._0_4_ = auVar79._0_4_ * auVar82._0_4_;
  auVar88._4_4_ = auVar79._4_4_ * auVar82._4_4_;
  auVar88._8_4_ = auVar79._8_4_ * auVar82._8_4_;
  auVar88._12_4_ = auVar79._12_4_ * auVar82._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar21);
  auVar168._0_4_ = auVar20._0_4_ * auVar83._0_4_;
  auVar168._4_4_ = auVar20._4_4_ * auVar83._4_4_;
  auVar168._8_4_ = auVar20._8_4_ * auVar83._8_4_;
  auVar168._12_4_ = auVar20._12_4_ * auVar83._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar83 = vpmovsxwd_avx(auVar79);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar21);
  auVar86._0_4_ = auVar20._0_4_ * auVar83._0_4_;
  auVar86._4_4_ = auVar20._4_4_ * auVar83._4_4_;
  auVar86._8_4_ = auVar20._8_4_ * auVar83._8_4_;
  auVar86._12_4_ = auVar20._12_4_ * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar191,auVar184);
  auVar82 = vpminsd_avx(auVar198,auVar88);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar82 = vpminsd_avx(auVar168,auVar86);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar20._4_4_ = uVar140;
  auVar20._0_4_ = uVar140;
  auVar20._8_4_ = uVar140;
  auVar20._12_4_ = uVar140;
  auVar82 = vmaxps_avx512vl(auVar82,auVar20);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar21._8_4_ = 0x3f7ffffa;
  auVar21._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar21._12_4_ = 0x3f7ffffa;
  local_150 = vmulps_avx512vl(auVar83,auVar21);
  auVar83 = vpmaxsd_avx(auVar191,auVar184);
  auVar82 = vpmaxsd_avx(auVar198,auVar88);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar82 = vpmaxsd_avx(auVar168,auVar86);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar80._4_4_ = uVar140;
  auVar80._0_4_ = uVar140;
  auVar80._8_4_ = uVar140;
  auVar80._12_4_ = uVar140;
  auVar82 = vminps_avx512vl(auVar82,auVar80);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar22._8_4_ = 0x3f800003;
  auVar22._0_8_ = 0x3f8000033f800003;
  auVar22._12_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar22);
  uVar23 = vcmpps_avx512vl(local_150,auVar83,2);
  uVar26 = vpcmpgtd_avx512vl(auVar78,_DAT_01f4ad30);
  uVar71 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar23 & 0xf & (byte)uVar26));
  local_548 = pre->ray_space + k;
  local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b8 = pre;
  local_5b0 = prim;
  do {
    auVar101 = local_500;
    if (uVar71 == 0) {
      return;
    }
    lVar70 = 0;
    for (uVar66 = uVar71; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
      lVar70 = lVar70 + 1;
    }
    uVar8 = *(uint *)(prim + 2);
    uVar73 = *(uint *)(prim + lVar70 * 4 + 6);
    local_5a8 = (ulong)uVar73;
    pGVar69 = (context->scene->geometries).items[uVar8].ptr;
    uVar66 = (ulong)*(uint *)(*(long *)&pGVar69->field_0x58 +
                             pGVar69[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * local_5a8);
    p_Var11 = pGVar69[1].intersectionFilterN;
    lVar70 = *(long *)&pGVar69[1].time_range.upper;
    local_5a0 = *(undefined1 (*) [16])(lVar70 + (long)p_Var11 * uVar66);
    pauVar3 = (undefined1 (*) [16])(lVar70 + (uVar66 + 1) * (long)p_Var11);
    uVar23 = *(undefined8 *)*pauVar3;
    uVar26 = *(undefined8 *)(*pauVar3 + 8);
    auVar21 = *pauVar3;
    auVar79 = *pauVar3;
    auVar18 = *pauVar3;
    auVar83 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar70 + (uVar66 + 2) * (long)p_Var11);
    uVar58 = *(undefined8 *)*pauVar4;
    uVar59 = *(undefined8 *)(*pauVar4 + 8);
    auVar20 = *pauVar4;
    auVar19 = *pauVar4;
    auVar78 = *pauVar4;
    auVar82 = *pauVar4;
    uVar71 = uVar71 - 1 & uVar71;
    pauVar5 = (undefined1 (*) [12])(lVar70 + (uVar66 + 3) * (long)p_Var11);
    uVar60 = *(undefined8 *)*pauVar5;
    uVar61 = *(undefined8 *)(*pauVar5 + 8);
    local_600 = (float)uVar60;
    fStack_5fc = (float)((ulong)uVar60 >> 0x20);
    fStack_5f8 = (float)uVar61;
    fStack_5f4 = (float)((ulong)uVar61 >> 0x20);
    if (uVar71 != 0) {
      uVar72 = uVar71 - 1 & uVar71;
      for (uVar66 = uVar71; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
      }
      if (uVar72 != 0) {
        for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar9 = (int)pGVar69[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar87 = vsubps_avx(local_5a0,auVar80);
    uVar140 = auVar87._0_4_;
    auVar159._4_4_ = uVar140;
    auVar159._0_4_ = uVar140;
    auVar159._8_4_ = uVar140;
    auVar159._12_4_ = uVar140;
    auVar22 = vshufps_avx(auVar87,auVar87,0x55);
    aVar6 = (local_548->vx).field_0;
    aVar7 = (local_548->vy).field_0;
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    fVar157 = (local_548->vz).field_0.m128[0];
    fVar151 = *(float *)((long)&(local_548->vz).field_0 + 4);
    fVar152 = *(float *)((long)&(local_548->vz).field_0 + 8);
    fVar153 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
    auVar202._0_4_ = fVar157 * auVar87._0_4_;
    auVar202._4_4_ = fVar151 * auVar87._4_4_;
    auVar202._8_4_ = fVar152 * auVar87._8_4_;
    auVar202._12_4_ = fVar153 * auVar87._12_4_;
    auVar22 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar7,auVar22);
    auVar81 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar6,auVar159);
    auVar22 = vshufps_avx(local_5a0,local_5a0,0xff);
    auVar84 = vsubps_avx512vl(auVar83,auVar80);
    uVar140 = auVar84._0_4_;
    auVar169._4_4_ = uVar140;
    auVar169._0_4_ = uVar140;
    auVar169._8_4_ = uVar140;
    auVar169._12_4_ = uVar140;
    auVar87 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar203._0_4_ = fVar157 * auVar84._0_4_;
    auVar203._4_4_ = fVar151 * auVar84._4_4_;
    auVar203._8_4_ = fVar152 * auVar84._8_4_;
    auVar203._12_4_ = fVar153 * auVar84._12_4_;
    auVar87 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar7,auVar87);
    auVar141 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar6,auVar169);
    auVar85 = vshufps_avx512vl(auVar83,auVar83,0xff);
    auVar84 = vsubps_avx512vl(auVar82,auVar80);
    uVar140 = auVar84._0_4_;
    auVar200._4_4_ = uVar140;
    auVar200._0_4_ = uVar140;
    auVar200._8_4_ = uVar140;
    auVar200._12_4_ = uVar140;
    auVar87 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar207._0_4_ = fVar157 * auVar84._0_4_;
    auVar207._4_4_ = fVar151 * auVar84._4_4_;
    auVar207._8_4_ = fVar152 * auVar84._8_4_;
    auVar207._12_4_ = fVar153 * auVar84._12_4_;
    auVar87 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar7,auVar87);
    auVar84 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar6,auVar200);
    auVar86 = vshufps_avx512vl(auVar82,auVar82,0xff);
    auVar62._12_4_ = fStack_5f4;
    auVar62._0_12_ = *pauVar5;
    auVar87 = vsubps_avx512vl(auVar62,auVar80);
    uVar140 = auVar87._0_4_;
    auVar170._4_4_ = uVar140;
    auVar170._0_4_ = uVar140;
    auVar170._8_4_ = uVar140;
    auVar170._12_4_ = uVar140;
    auVar80 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar212._0_4_ = fVar157 * auVar87._0_4_;
    auVar212._4_4_ = fVar151 * auVar87._4_4_;
    auVar212._8_4_ = fVar152 * auVar87._8_4_;
    auVar212._12_4_ = fVar153 * auVar87._12_4_;
    auVar80 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar7,auVar80);
    auVar87 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar6,auVar170);
    auVar80 = vshufps_avx512vl(auVar62,auVar62,0xff);
    lVar70 = (long)iVar9 * 0x44;
    auVar105 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70);
    uVar140 = auVar81._0_4_;
    local_2a0._4_4_ = uVar140;
    local_2a0._0_4_ = uVar140;
    local_2a0._8_4_ = uVar140;
    local_2a0._12_4_ = uVar140;
    local_2a0._16_4_ = uVar140;
    local_2a0._20_4_ = uVar140;
    local_2a0._24_4_ = uVar140;
    local_2a0._28_4_ = uVar140;
    auVar89._8_4_ = 1;
    auVar89._0_8_ = 0x100000001;
    auVar89._12_4_ = 1;
    auVar89._16_4_ = 1;
    auVar89._20_4_ = 1;
    auVar89._24_4_ = 1;
    auVar89._28_4_ = 1;
    local_2c0 = vpermps_avx2(auVar89,ZEXT1632(auVar81));
    local_80 = vbroadcastsd_avx512vl(auVar22);
    auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 + 0x484);
    uVar140 = auVar141._0_4_;
    auVar155._4_4_ = uVar140;
    auVar155._0_4_ = uVar140;
    auVar155._8_4_ = uVar140;
    auVar155._12_4_ = uVar140;
    local_2e0._16_4_ = uVar140;
    local_2e0._0_16_ = auVar155;
    local_2e0._20_4_ = uVar140;
    local_2e0._24_4_ = uVar140;
    local_2e0._28_4_ = uVar140;
    local_300 = vpermps_avx512vl(auVar89,ZEXT1632(auVar141));
    local_a0 = vbroadcastsd_avx512vl(auVar85);
    auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 + 0x908);
    uVar140 = auVar84._0_4_;
    local_320._4_4_ = uVar140;
    local_320._0_4_ = uVar140;
    local_320._8_4_ = uVar140;
    local_320._12_4_ = uVar140;
    local_320._16_4_ = uVar140;
    local_320._20_4_ = uVar140;
    local_320._24_4_ = uVar140;
    local_320._28_4_ = uVar140;
    local_340 = vpermps_avx512vl(auVar89,ZEXT1632(auVar84));
    local_c0 = vbroadcastsd_avx512vl(auVar86);
    auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 + 0xd8c);
    fVar151 = auVar87._0_4_;
    local_360._4_4_ = fVar151;
    local_360._0_4_ = fVar151;
    fStack_358 = fVar151;
    fStack_354 = fVar151;
    fStack_350 = fVar151;
    fStack_34c = fVar151;
    fStack_348 = fVar151;
    register0x0000139c = fVar151;
    _local_380 = vpermps_avx512vl(auVar89,ZEXT1632(auVar87));
    local_e0 = vbroadcastsd_avx512vl(auVar80);
    auVar89 = vmulps_avx512vl(_local_360,auVar103);
    auVar90 = vmulps_avx512vl(_local_380,auVar103);
    auVar80 = vfmadd231ps_fma(auVar89,auVar104,local_320);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar104,local_340);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar106,local_2e0);
    auVar91 = vfmadd231ps_avx512vl(auVar89,auVar106,local_300);
    auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar105,local_2a0);
    auVar196 = ZEXT3264(auVar92);
    auVar89 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70);
    auVar90 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 + 0x484);
    auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 + 0x908);
    auVar93 = vfmadd231ps_avx512vl(auVar91,auVar105,local_2c0);
    auVar189 = ZEXT3264(auVar93);
    auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 + 0xd8c);
    auVar94 = vmulps_avx512vl(_local_360,auVar91);
    auVar95 = vmulps_avx512vl(_local_380,auVar91);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_320);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,local_340);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_2e0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_300);
    auVar22 = vfmadd231ps_fma(auVar94,auVar89,local_2a0);
    auVar201 = ZEXT1664(auVar22);
    auVar85 = vfmadd231ps_fma(auVar95,auVar89,local_2c0);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar22),auVar92);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar85),auVar93);
    auVar96 = vmulps_avx512vl(auVar93,auVar94);
    auVar97 = vmulps_avx512vl(auVar92,auVar95);
    auVar96 = vsubps_avx512vl(auVar96,auVar97);
    auVar97 = vmulps_avx512vl(local_e0,auVar103);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,local_a0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,local_80);
    auVar98 = vmulps_avx512vl(local_e0,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_c0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar90,local_a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,local_80);
    auVar99 = vmulps_avx512vl(auVar95,auVar95);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar94);
    auVar100 = vmaxps_avx512vl(auVar97,auVar98);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vmulps_avx512vl(auVar100,auVar99);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    uVar24 = vcmpps_avx512vl(auVar96,auVar99,2);
    auVar80 = vblendps_avx(auVar81,local_5a0,8);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar80 = vandps_avx512vl(auVar80,auVar86);
    auVar83 = vblendps_avx(auVar141,auVar83,8);
    auVar83 = vandps_avx512vl(auVar83,auVar86);
    auVar80 = vmaxps_avx(auVar80,auVar83);
    auVar83 = vblendps_avx(auVar84,auVar82,8);
    auVar82 = vandps_avx512vl(auVar83,auVar86);
    auVar83 = vblendps_avx(auVar87,auVar62,8);
    auVar83 = vandps_avx512vl(auVar83,auVar86);
    auVar83 = vmaxps_avx(auVar82,auVar83);
    auVar83 = vmaxps_avx(auVar80,auVar83);
    auVar82 = vmovshdup_avx(auVar83);
    auVar82 = vmaxss_avx(auVar82,auVar83);
    auVar83 = vshufpd_avx(auVar83,auVar83,1);
    auVar83 = vmaxss_avx(auVar83,auVar82);
    auVar99._0_4_ = (float)iVar9;
    local_500._4_12_ = auVar81._4_12_;
    local_500._0_4_ = auVar99._0_4_;
    local_500._16_16_ = auVar101._16_16_;
    auVar99._4_4_ = auVar99._0_4_;
    auVar99._8_4_ = auVar99._0_4_;
    auVar99._12_4_ = auVar99._0_4_;
    auVar99._16_4_ = auVar99._0_4_;
    auVar99._20_4_ = auVar99._0_4_;
    auVar99._24_4_ = auVar99._0_4_;
    auVar99._28_4_ = auVar99._0_4_;
    uVar25 = vcmpps_avx512vl(auVar99,_DAT_01f7b060,0xe);
    bVar74 = (byte)uVar24 & (byte)uVar25;
    fVar157 = auVar83._0_4_ * 4.7683716e-07;
    local_560 = ZEXT416((uint)fVar157);
    auVar96._8_4_ = 2;
    auVar96._0_8_ = 0x200000002;
    auVar96._12_4_ = 2;
    auVar96._16_4_ = 2;
    auVar96._20_4_ = 2;
    auVar96._24_4_ = 2;
    auVar96._28_4_ = 2;
    local_480 = vpermps_avx512vl(auVar96,ZEXT1632(auVar81));
    auVar215 = ZEXT3264(local_480);
    local_4a0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar141));
    auVar217 = ZEXT3264(local_4a0);
    auVar101 = vpermps_avx512vl(auVar96,ZEXT1632(auVar84));
    local_140 = vpermps_avx2(auVar96,ZEXT1632(auVar87));
    local_440 = *(undefined4 *)(ray + k * 4 + 0x30);
    uStack_43c = 0;
    uStack_438 = 0;
    uStack_434 = 0;
    local_4b0 = vpbroadcastd_avx512vl();
    local_4c0 = vpbroadcastd_avx512vl();
    if (bVar74 != 0) {
      auVar91 = vmulps_avx512vl(local_140,auVar91);
      auVar102 = vfmadd213ps_avx512vl(auVar102,auVar101,auVar91);
      auVar90 = vfmadd213ps_avx512vl(auVar90,local_4a0,auVar102);
      auVar96 = vfmadd213ps_avx512vl(auVar89,local_480,auVar90);
      auVar103 = vmulps_avx512vl(local_140,auVar103);
      auVar104 = vfmadd213ps_avx512vl(auVar104,auVar101,auVar103);
      auVar90 = vfmadd213ps_avx512vl(auVar106,local_4a0,auVar104);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 + 0x1210);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 + 0x1b18);
      auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar105,local_480,auVar90);
      auVar204._0_4_ = fVar151 * auVar89._0_4_;
      auVar204._4_4_ = fVar151 * auVar89._4_4_;
      auVar204._8_4_ = fVar151 * auVar89._8_4_;
      auVar204._12_4_ = fVar151 * auVar89._12_4_;
      auVar204._16_4_ = fVar151 * auVar89._16_4_;
      auVar204._20_4_ = fVar151 * auVar89._20_4_;
      auVar204._24_4_ = fVar151 * auVar89._24_4_;
      auVar204._28_4_ = 0;
      auVar105 = vmulps_avx512vl(_local_380,auVar89);
      auVar89 = vmulps_avx512vl(local_140,auVar89);
      auVar90 = vfmadd231ps_avx512vl(auVar204,auVar103,local_320);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_340);
      auVar103 = vfmadd231ps_avx512vl(auVar89,auVar101,auVar103);
      auVar89 = vfmadd231ps_avx512vl(auVar90,auVar104,local_2e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar104,local_300);
      auVar90 = vfmadd231ps_avx512vl(auVar103,local_4a0,auVar104);
      auVar83 = vfmadd231ps_fma(auVar89,auVar106,local_2a0);
      auVar89 = vfmadd231ps_avx512vl(auVar105,auVar106,local_2c0);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 + 0x1210);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 + 0x1b18);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 + 0x1f9c);
      auVar102 = vfmadd231ps_avx512vl(auVar90,local_480,auVar106);
      auVar90._4_4_ = fVar151 * auVar103._4_4_;
      auVar90._0_4_ = fVar151 * auVar103._0_4_;
      auVar90._8_4_ = fVar151 * auVar103._8_4_;
      auVar90._12_4_ = fVar151 * auVar103._12_4_;
      auVar90._16_4_ = fVar151 * auVar103._16_4_;
      auVar90._20_4_ = fVar151 * auVar103._20_4_;
      auVar90._24_4_ = fVar151 * auVar103._24_4_;
      auVar90._28_4_ = auVar106._28_4_;
      auVar106 = vmulps_avx512vl(_local_380,auVar103);
      auVar103 = vmulps_avx512vl(local_140,auVar103);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar104,local_320);
      auVar91 = vfmadd231ps_avx512vl(auVar106,auVar104,local_340);
      auVar215 = ZEXT3264(local_480);
      auVar217 = ZEXT3264(local_4a0);
      auVar216 = ZEXT3264(auVar101);
      auVar104 = vfmadd231ps_avx512vl(auVar103,auVar101,auVar104);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 + 0x1694);
      auVar103 = vfmadd231ps_avx512vl(auVar90,auVar106,local_2e0);
      auVar90 = vfmadd231ps_avx512vl(auVar91,auVar106,local_300);
      auVar106 = vfmadd231ps_avx512vl(auVar104,local_4a0,auVar106);
      auVar82 = vfmadd231ps_fma(auVar103,auVar105,local_2a0);
      auVar104 = vfmadd231ps_avx512vl(auVar90,auVar105,local_2c0);
      auVar103 = vfmadd231ps_avx512vl(auVar106,local_480,auVar105);
      auVar213._8_4_ = 0x7fffffff;
      auVar213._0_8_ = 0x7fffffff7fffffff;
      auVar213._12_4_ = 0x7fffffff;
      auVar213._16_4_ = 0x7fffffff;
      auVar213._20_4_ = 0x7fffffff;
      auVar213._24_4_ = 0x7fffffff;
      auVar213._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(ZEXT1632(auVar83),auVar213);
      auVar106 = vandps_avx(auVar89,auVar213);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vandps_avx(auVar102,auVar213);
      auVar105 = vmaxps_avx(auVar106,auVar105);
      auVar209._4_4_ = fVar157;
      auVar209._0_4_ = fVar157;
      auVar209._8_4_ = fVar157;
      auVar209._12_4_ = fVar157;
      auVar209._16_4_ = fVar157;
      auVar209._20_4_ = fVar157;
      auVar209._24_4_ = fVar157;
      auVar209._28_4_ = fVar157;
      uVar66 = vcmpps_avx512vl(auVar105,auVar209,1);
      bVar12 = (bool)((byte)uVar66 & 1);
      auVar107._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar83._0_4_);
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar83._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar83._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar83._12_4_);
      fVar152 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar94._16_4_);
      auVar107._16_4_ = fVar152;
      fVar151 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar94._20_4_);
      auVar107._20_4_ = fVar151;
      fVar153 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar94._24_4_);
      auVar107._24_4_ = fVar153;
      uVar67 = (uint)(byte)(uVar66 >> 7) * auVar94._28_4_;
      auVar107._28_4_ = uVar67;
      bVar12 = (bool)((byte)uVar66 & 1);
      auVar108._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar89._0_4_);
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar89._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar89._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar89._12_4_);
      bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar89._16_4_);
      bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar89._20_4_);
      bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar89._24_4_);
      bVar12 = SUB81(uVar66 >> 7,0);
      auVar108._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar89._28_4_;
      auVar105 = vandps_avx(auVar213,ZEXT1632(auVar82));
      auVar106 = vandps_avx(auVar104,auVar213);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vandps_avx(auVar103,auVar213);
      auVar105 = vmaxps_avx(auVar106,auVar105);
      uVar66 = vcmpps_avx512vl(auVar105,auVar209,1);
      bVar12 = (bool)((byte)uVar66 & 1);
      auVar109._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar82._0_4_);
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar82._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar82._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar82._12_4_);
      fVar165 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar94._16_4_);
      auVar109._16_4_ = fVar165;
      fVar164 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar94._20_4_);
      auVar109._20_4_ = fVar164;
      fVar182 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar94._24_4_);
      auVar109._24_4_ = fVar182;
      auVar109._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar94._28_4_;
      bVar12 = (bool)((byte)uVar66 & 1);
      auVar110._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar104._0_4_);
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar104._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar104._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar104._12_4_);
      bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar104._16_4_);
      bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar104._20_4_);
      bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar104._24_4_);
      bVar12 = SUB81(uVar66 >> 7,0);
      auVar110._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar104._28_4_;
      auVar88 = vxorps_avx512vl(auVar155,auVar155);
      auVar105 = vfmadd213ps_avx512vl(auVar107,auVar107,ZEXT1632(auVar88));
      auVar83 = vfmadd231ps_fma(auVar105,auVar108,auVar108);
      auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar76 = auVar104._0_4_;
      fVar77 = auVar104._4_4_;
      fVar132 = auVar104._8_4_;
      fVar133 = auVar104._12_4_;
      fVar134 = auVar104._16_4_;
      fVar135 = auVar104._20_4_;
      fVar136 = auVar104._24_4_;
      auVar105._4_4_ = fVar77 * fVar77 * fVar77 * auVar83._4_4_ * -0.5;
      auVar105._0_4_ = fVar76 * fVar76 * fVar76 * auVar83._0_4_ * -0.5;
      auVar105._8_4_ = fVar132 * fVar132 * fVar132 * auVar83._8_4_ * -0.5;
      auVar105._12_4_ = fVar133 * fVar133 * fVar133 * auVar83._12_4_ * -0.5;
      auVar105._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar105._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar105._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar105._28_4_ = 0;
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar89,auVar104);
      auVar106._4_4_ = auVar108._4_4_ * auVar105._4_4_;
      auVar106._0_4_ = auVar108._0_4_ * auVar105._0_4_;
      auVar106._8_4_ = auVar108._8_4_ * auVar105._8_4_;
      auVar106._12_4_ = auVar108._12_4_ * auVar105._12_4_;
      auVar106._16_4_ = auVar108._16_4_ * auVar105._16_4_;
      auVar106._20_4_ = auVar108._20_4_ * auVar105._20_4_;
      auVar106._24_4_ = auVar108._24_4_ * auVar105._24_4_;
      auVar106._28_4_ = auVar104._28_4_;
      auVar104._4_4_ = auVar105._4_4_ * -auVar107._4_4_;
      auVar104._0_4_ = auVar105._0_4_ * -auVar107._0_4_;
      auVar104._8_4_ = auVar105._8_4_ * -auVar107._8_4_;
      auVar104._12_4_ = auVar105._12_4_ * -auVar107._12_4_;
      auVar104._16_4_ = auVar105._16_4_ * -fVar152;
      auVar104._20_4_ = auVar105._20_4_ * -fVar151;
      auVar104._24_4_ = auVar105._24_4_ * -fVar153;
      auVar104._28_4_ = uVar67 ^ 0x80000000;
      auVar90 = vmulps_avx512vl(auVar105,ZEXT1632(auVar88));
      auVar94 = ZEXT1632(auVar88);
      auVar103 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar94);
      auVar83 = vfmadd231ps_fma(auVar103,auVar110,auVar110);
      auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar151 = auVar91._0_4_;
      fVar152 = auVar91._4_4_;
      fVar153 = auVar91._8_4_;
      fVar76 = auVar91._12_4_;
      fVar77 = auVar91._16_4_;
      fVar132 = auVar91._20_4_;
      fVar133 = auVar91._24_4_;
      auVar103._4_4_ = fVar152 * fVar152 * fVar152 * auVar83._4_4_ * -0.5;
      auVar103._0_4_ = fVar151 * fVar151 * fVar151 * auVar83._0_4_ * -0.5;
      auVar103._8_4_ = fVar153 * fVar153 * fVar153 * auVar83._8_4_ * -0.5;
      auVar103._12_4_ = fVar76 * fVar76 * fVar76 * auVar83._12_4_ * -0.5;
      auVar103._16_4_ = fVar77 * fVar77 * fVar77 * -0.0;
      auVar103._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar103._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar103._28_4_ = 0;
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar89,auVar91);
      auVar102._4_4_ = auVar110._4_4_ * auVar103._4_4_;
      auVar102._0_4_ = auVar110._0_4_ * auVar103._0_4_;
      auVar102._8_4_ = auVar110._8_4_ * auVar103._8_4_;
      auVar102._12_4_ = auVar110._12_4_ * auVar103._12_4_;
      auVar102._16_4_ = auVar110._16_4_ * auVar103._16_4_;
      auVar102._20_4_ = auVar110._20_4_ * auVar103._20_4_;
      auVar102._24_4_ = auVar110._24_4_ * auVar103._24_4_;
      auVar102._28_4_ = auVar91._28_4_;
      auVar91._4_4_ = -auVar109._4_4_ * auVar103._4_4_;
      auVar91._0_4_ = -auVar109._0_4_ * auVar103._0_4_;
      auVar91._8_4_ = -auVar109._8_4_ * auVar103._8_4_;
      auVar91._12_4_ = -auVar109._12_4_ * auVar103._12_4_;
      auVar91._16_4_ = -fVar165 * auVar103._16_4_;
      auVar91._20_4_ = -fVar164 * auVar103._20_4_;
      auVar91._24_4_ = -fVar182 * auVar103._24_4_;
      auVar91._28_4_ = auVar105._28_4_;
      auVar105 = vmulps_avx512vl(auVar103,auVar94);
      auVar83 = vfmadd213ps_fma(auVar106,auVar97,auVar92);
      auVar82 = vfmadd213ps_fma(auVar104,auVar97,auVar93);
      auVar103 = vfmadd213ps_avx512vl(auVar90,auVar97,auVar100);
      auVar89 = vfmadd213ps_avx512vl(auVar102,auVar98,ZEXT1632(auVar22));
      auVar81 = vfnmadd213ps_fma(auVar106,auVar97,auVar92);
      auVar80 = vfmadd213ps_fma(auVar91,auVar98,ZEXT1632(auVar85));
      auVar141 = vfnmadd213ps_fma(auVar104,auVar97,auVar93);
      auVar87 = vfmadd213ps_fma(auVar105,auVar98,auVar96);
      auVar106 = vfnmadd231ps_avx512vl(auVar100,auVar97,auVar90);
      auVar86 = vfnmadd213ps_fma(auVar102,auVar98,ZEXT1632(auVar22));
      auVar85 = vfnmadd213ps_fma(auVar91,auVar98,ZEXT1632(auVar85));
      auVar154 = vfnmadd231ps_fma(auVar96,auVar98,auVar105);
      auVar104 = vsubps_avx512vl(auVar89,ZEXT1632(auVar81));
      auVar105 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar141));
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar87),auVar106);
      auVar102 = vmulps_avx512vl(auVar105,auVar106);
      auVar22 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar141),auVar90);
      auVar92._4_4_ = auVar81._4_4_ * auVar90._4_4_;
      auVar92._0_4_ = auVar81._0_4_ * auVar90._0_4_;
      auVar92._8_4_ = auVar81._8_4_ * auVar90._8_4_;
      auVar92._12_4_ = auVar81._12_4_ * auVar90._12_4_;
      auVar92._16_4_ = auVar90._16_4_ * 0.0;
      auVar92._20_4_ = auVar90._20_4_ * 0.0;
      auVar92._24_4_ = auVar90._24_4_ * 0.0;
      auVar92._28_4_ = auVar90._28_4_;
      auVar90 = vfmsub231ps_avx512vl(auVar92,auVar106,auVar104);
      auVar93._4_4_ = auVar141._4_4_ * auVar104._4_4_;
      auVar93._0_4_ = auVar141._0_4_ * auVar104._0_4_;
      auVar93._8_4_ = auVar141._8_4_ * auVar104._8_4_;
      auVar93._12_4_ = auVar141._12_4_ * auVar104._12_4_;
      auVar93._16_4_ = auVar104._16_4_ * 0.0;
      auVar93._20_4_ = auVar104._20_4_ * 0.0;
      auVar93._24_4_ = auVar104._24_4_ * 0.0;
      auVar93._28_4_ = auVar104._28_4_;
      auVar84 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar81),auVar105);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar94,auVar90);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar94,ZEXT1632(auVar22));
      auVar96 = ZEXT1632(auVar88);
      uVar66 = vcmpps_avx512vl(auVar105,auVar96,2);
      bVar65 = (byte)uVar66;
      fVar76 = (float)((uint)(bVar65 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar86._0_4_);
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      fVar132 = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar86._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      fVar134 = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar86._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      fVar136 = (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar86._12_4_);
      auVar102 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar76))));
      fVar77 = (float)((uint)(bVar65 & 1) * auVar82._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar85._0_4_);
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      fVar133 = (float)((uint)bVar12 * auVar82._4_4_ | (uint)!bVar12 * auVar85._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      fVar135 = (float)((uint)bVar12 * auVar82._8_4_ | (uint)!bVar12 * auVar85._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      fVar137 = (float)((uint)bVar12 * auVar82._12_4_ | (uint)!bVar12 * auVar85._12_4_);
      auVar91 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar77))));
      auVar111._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar154._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar154._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar154._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar154._12_4_);
      fVar151 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar103._16_4_);
      auVar111._16_4_ = fVar151;
      fVar152 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar103._20_4_);
      auVar111._20_4_ = fVar152;
      fVar153 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar103._24_4_);
      auVar111._24_4_ = fVar153;
      iVar1 = (uint)(byte)(uVar66 >> 7) * auVar103._28_4_;
      auVar111._28_4_ = iVar1;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar89);
      auVar112._0_4_ =
           (uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar82._0_4_;
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar82._4_4_;
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar82._8_4_;
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar82._12_4_;
      auVar112._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar104._16_4_;
      auVar112._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar104._20_4_;
      auVar112._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar104._24_4_;
      auVar112._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar141),ZEXT1632(auVar80));
      auVar113._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar22._0_4_);
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar22._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar22._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar22._12_4_);
      fVar182 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar104._16_4_);
      auVar113._16_4_ = fVar182;
      fVar165 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar104._20_4_);
      auVar113._20_4_ = fVar165;
      fVar164 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar104._24_4_);
      auVar113._24_4_ = fVar164;
      auVar113._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar87));
      auVar114._0_4_ =
           (float)((uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar103._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar103._4_4_);
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar103._8_4_);
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar103._12_4_);
      bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar114._16_4_ = (float)((uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * auVar103._16_4_);
      bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar114._20_4_ = (float)((uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * auVar103._20_4_);
      bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar114._24_4_ = (float)((uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * auVar103._24_4_);
      bVar12 = SUB81(uVar66 >> 7,0);
      auVar114._28_4_ = (uint)bVar12 * auVar104._28_4_ | (uint)!bVar12 * auVar103._28_4_;
      auVar115._0_4_ =
           (uint)(bVar65 & 1) * (int)auVar81._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar89._0_4_;
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar12 * (int)auVar81._4_4_ | (uint)!bVar12 * auVar89._4_4_;
      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar12 * (int)auVar81._8_4_ | (uint)!bVar12 * auVar89._8_4_;
      bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar12 * (int)auVar81._12_4_ | (uint)!bVar12 * auVar89._12_4_;
      auVar115._16_4_ = (uint)!(bool)((byte)(uVar66 >> 4) & 1) * auVar89._16_4_;
      auVar115._20_4_ = (uint)!(bool)((byte)(uVar66 >> 5) & 1) * auVar89._20_4_;
      auVar115._24_4_ = (uint)!(bool)((byte)(uVar66 >> 6) & 1) * auVar89._24_4_;
      auVar115._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar89._28_4_;
      bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar116._0_4_ =
           (uint)(bVar65 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar87._0_4_;
      bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar87._4_4_;
      bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar87._8_4_;
      bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar87._12_4_;
      auVar116._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar106._16_4_;
      auVar116._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar106._20_4_;
      auVar116._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar106._24_4_;
      iVar2 = (uint)(byte)(uVar66 >> 7) * auVar106._28_4_;
      auVar116._28_4_ = iVar2;
      auVar92 = vsubps_avx512vl(auVar115,auVar102);
      auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar141._12_4_ |
                                               (uint)!bVar15 * auVar80._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar141._8_4_ |
                                                        (uint)!bVar14 * auVar80._8_4_,
                                                        CONCAT44((uint)bVar12 * (int)auVar141._4_4_
                                                                 | (uint)!bVar12 * auVar80._4_4_,
                                                                 (uint)(bVar65 & 1) *
                                                                 (int)auVar141._0_4_ |
                                                                 (uint)!(bool)(bVar65 & 1) *
                                                                 auVar80._0_4_)))),auVar91);
      auVar196 = ZEXT3264(auVar106);
      auVar104 = vsubps_avx(auVar116,auVar111);
      auVar103 = vsubps_avx(auVar102,auVar112);
      auVar201 = ZEXT3264(auVar103);
      auVar89 = vsubps_avx(auVar91,auVar113);
      auVar90 = vsubps_avx(auVar111,auVar114);
      auVar94._4_4_ = auVar104._4_4_ * fVar132;
      auVar94._0_4_ = auVar104._0_4_ * fVar76;
      auVar94._8_4_ = auVar104._8_4_ * fVar134;
      auVar94._12_4_ = auVar104._12_4_ * fVar136;
      auVar94._16_4_ = auVar104._16_4_ * 0.0;
      auVar94._20_4_ = auVar104._20_4_ * 0.0;
      auVar94._24_4_ = auVar104._24_4_ * 0.0;
      auVar94._28_4_ = iVar2;
      auVar83 = vfmsub231ps_fma(auVar94,auVar111,auVar92);
      auVar95._4_4_ = fVar133 * auVar92._4_4_;
      auVar95._0_4_ = fVar77 * auVar92._0_4_;
      auVar95._8_4_ = fVar135 * auVar92._8_4_;
      auVar95._12_4_ = fVar137 * auVar92._12_4_;
      auVar95._16_4_ = auVar92._16_4_ * 0.0;
      auVar95._20_4_ = auVar92._20_4_ * 0.0;
      auVar95._24_4_ = auVar92._24_4_ * 0.0;
      auVar95._28_4_ = auVar105._28_4_;
      auVar82 = vfmsub231ps_fma(auVar95,auVar102,auVar106);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar96,ZEXT1632(auVar83));
      auVar185._0_4_ = auVar106._0_4_ * auVar111._0_4_;
      auVar185._4_4_ = auVar106._4_4_ * auVar111._4_4_;
      auVar185._8_4_ = auVar106._8_4_ * auVar111._8_4_;
      auVar185._12_4_ = auVar106._12_4_ * auVar111._12_4_;
      auVar185._16_4_ = auVar106._16_4_ * fVar151;
      auVar185._20_4_ = auVar106._20_4_ * fVar152;
      auVar185._24_4_ = auVar106._24_4_ * fVar153;
      auVar185._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar185,auVar91,auVar104);
      auVar93 = vfmadd231ps_avx512vl(auVar105,auVar96,ZEXT1632(auVar83));
      auVar105 = vmulps_avx512vl(auVar90,auVar112);
      auVar105 = vfmsub231ps_avx512vl(auVar105,auVar103,auVar114);
      auVar100._4_4_ = auVar89._4_4_ * auVar114._4_4_;
      auVar100._0_4_ = auVar89._0_4_ * auVar114._0_4_;
      auVar100._8_4_ = auVar89._8_4_ * auVar114._8_4_;
      auVar100._12_4_ = auVar89._12_4_ * auVar114._12_4_;
      auVar100._16_4_ = auVar89._16_4_ * auVar114._16_4_;
      auVar100._20_4_ = auVar89._20_4_ * auVar114._20_4_;
      auVar100._24_4_ = auVar89._24_4_ * auVar114._24_4_;
      auVar100._28_4_ = auVar114._28_4_;
      auVar83 = vfmsub231ps_fma(auVar100,auVar113,auVar90);
      auVar186._0_4_ = auVar113._0_4_ * auVar103._0_4_;
      auVar186._4_4_ = auVar113._4_4_ * auVar103._4_4_;
      auVar186._8_4_ = auVar113._8_4_ * auVar103._8_4_;
      auVar186._12_4_ = auVar113._12_4_ * auVar103._12_4_;
      auVar186._16_4_ = fVar182 * auVar103._16_4_;
      auVar186._20_4_ = fVar165 * auVar103._20_4_;
      auVar186._24_4_ = fVar164 * auVar103._24_4_;
      auVar186._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar186,auVar89,auVar112);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar96,auVar105);
      auVar94 = vfmadd231ps_avx512vl(auVar105,auVar96,ZEXT1632(auVar83));
      auVar189 = ZEXT3264(auVar94);
      auVar105 = vmaxps_avx(auVar93,auVar94);
      uVar24 = vcmpps_avx512vl(auVar105,auVar96,2);
      bVar74 = bVar74 & (byte)uVar24;
      if (bVar74 != 0) {
        auVar35._4_4_ = auVar90._4_4_ * auVar106._4_4_;
        auVar35._0_4_ = auVar90._0_4_ * auVar106._0_4_;
        auVar35._8_4_ = auVar90._8_4_ * auVar106._8_4_;
        auVar35._12_4_ = auVar90._12_4_ * auVar106._12_4_;
        auVar35._16_4_ = auVar90._16_4_ * auVar106._16_4_;
        auVar35._20_4_ = auVar90._20_4_ * auVar106._20_4_;
        auVar35._24_4_ = auVar90._24_4_ * auVar106._24_4_;
        auVar35._28_4_ = auVar105._28_4_;
        auVar22 = vfmsub231ps_fma(auVar35,auVar89,auVar104);
        auVar36._4_4_ = auVar104._4_4_ * auVar103._4_4_;
        auVar36._0_4_ = auVar104._0_4_ * auVar103._0_4_;
        auVar36._8_4_ = auVar104._8_4_ * auVar103._8_4_;
        auVar36._12_4_ = auVar104._12_4_ * auVar103._12_4_;
        auVar36._16_4_ = auVar104._16_4_ * auVar103._16_4_;
        auVar36._20_4_ = auVar104._20_4_ * auVar103._20_4_;
        auVar36._24_4_ = auVar104._24_4_ * auVar103._24_4_;
        auVar36._28_4_ = auVar104._28_4_;
        auVar80 = vfmsub231ps_fma(auVar36,auVar92,auVar90);
        auVar37._4_4_ = auVar89._4_4_ * auVar92._4_4_;
        auVar37._0_4_ = auVar89._0_4_ * auVar92._0_4_;
        auVar37._8_4_ = auVar89._8_4_ * auVar92._8_4_;
        auVar37._12_4_ = auVar89._12_4_ * auVar92._12_4_;
        auVar37._16_4_ = auVar89._16_4_ * auVar92._16_4_;
        auVar37._20_4_ = auVar89._20_4_ * auVar92._20_4_;
        auVar37._24_4_ = auVar89._24_4_ * auVar92._24_4_;
        auVar37._28_4_ = auVar89._28_4_;
        auVar87 = vfmsub231ps_fma(auVar37,auVar103,auVar106);
        auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar87));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar22),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar105 = vrcp14ps_avx512vl(ZEXT1632(auVar82));
        auVar201 = ZEXT3264(auVar105);
        auVar29._8_4_ = 0x3f800000;
        auVar29._0_8_ = 0x3f8000003f800000;
        auVar29._12_4_ = 0x3f800000;
        auVar29._16_4_ = 0x3f800000;
        auVar29._20_4_ = 0x3f800000;
        auVar29._24_4_ = 0x3f800000;
        auVar29._28_4_ = 0x3f800000;
        auVar106 = vfnmadd213ps_avx512vl(auVar105,ZEXT1632(auVar82),auVar29);
        auVar83 = vfmadd132ps_fma(auVar106,auVar105,auVar105);
        auVar196 = ZEXT1664(auVar83);
        auVar38._4_4_ = auVar87._4_4_ * auVar111._4_4_;
        auVar38._0_4_ = auVar87._0_4_ * auVar111._0_4_;
        auVar38._8_4_ = auVar87._8_4_ * auVar111._8_4_;
        auVar38._12_4_ = auVar87._12_4_ * auVar111._12_4_;
        auVar38._16_4_ = fVar151 * 0.0;
        auVar38._20_4_ = fVar152 * 0.0;
        auVar38._24_4_ = fVar153 * 0.0;
        auVar38._28_4_ = iVar1;
        auVar80 = vfmadd231ps_fma(auVar38,auVar91,ZEXT1632(auVar80));
        auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar102,ZEXT1632(auVar22));
        fVar151 = auVar83._0_4_;
        fVar152 = auVar83._4_4_;
        fVar153 = auVar83._8_4_;
        fVar165 = auVar83._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar165,
                                       CONCAT48(auVar80._8_4_ * fVar153,
                                                CONCAT44(auVar80._4_4_ * fVar152,
                                                         auVar80._0_4_ * fVar151))));
        auVar208 = ZEXT3264(local_240);
        auVar144._4_4_ = local_440;
        auVar144._0_4_ = local_440;
        auVar144._8_4_ = local_440;
        auVar144._12_4_ = local_440;
        auVar144._16_4_ = local_440;
        auVar144._20_4_ = local_440;
        auVar144._24_4_ = local_440;
        auVar144._28_4_ = local_440;
        uVar24 = vcmpps_avx512vl(auVar144,local_240,2);
        uVar140 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar30._4_4_ = uVar140;
        auVar30._0_4_ = uVar140;
        auVar30._8_4_ = uVar140;
        auVar30._12_4_ = uVar140;
        auVar30._16_4_ = uVar140;
        auVar30._20_4_ = uVar140;
        auVar30._24_4_ = uVar140;
        auVar30._28_4_ = uVar140;
        uVar25 = vcmpps_avx512vl(local_240,auVar30,2);
        bVar74 = (byte)uVar24 & (byte)uVar25 & bVar74;
        if (bVar74 != 0) {
          uVar72 = vcmpps_avx512vl(ZEXT1632(auVar82),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar72 = bVar74 & uVar72;
          if ((char)uVar72 != '\0') {
            fVar164 = auVar93._0_4_ * fVar151;
            fVar182 = auVar93._4_4_ * fVar152;
            auVar39._4_4_ = fVar182;
            auVar39._0_4_ = fVar164;
            fVar76 = auVar93._8_4_ * fVar153;
            auVar39._8_4_ = fVar76;
            fVar77 = auVar93._12_4_ * fVar165;
            auVar39._12_4_ = fVar77;
            fVar132 = auVar93._16_4_ * 0.0;
            auVar39._16_4_ = fVar132;
            fVar133 = auVar93._20_4_ * 0.0;
            auVar39._20_4_ = fVar133;
            fVar134 = auVar93._24_4_ * 0.0;
            auVar39._24_4_ = fVar134;
            auVar39._28_4_ = auVar93._28_4_;
            auVar145._8_4_ = 0x3f800000;
            auVar145._0_8_ = 0x3f8000003f800000;
            auVar145._12_4_ = 0x3f800000;
            auVar145._16_4_ = 0x3f800000;
            auVar145._20_4_ = 0x3f800000;
            auVar145._24_4_ = 0x3f800000;
            auVar145._28_4_ = 0x3f800000;
            auVar105 = vsubps_avx(auVar145,auVar39);
            local_280._0_4_ =
                 (float)((uint)(bVar65 & 1) * (int)fVar164 |
                        (uint)!(bool)(bVar65 & 1) * auVar105._0_4_);
            bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar12 * (int)fVar182 | (uint)!bVar12 * auVar105._4_4_);
            bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar12 * (int)fVar76 | (uint)!bVar12 * auVar105._8_4_);
            bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar12 * (int)fVar77 | (uint)!bVar12 * auVar105._12_4_)
            ;
            bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
            local_280._16_4_ =
                 (float)((uint)bVar12 * (int)fVar132 | (uint)!bVar12 * auVar105._16_4_);
            bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
            local_280._20_4_ =
                 (float)((uint)bVar12 * (int)fVar133 | (uint)!bVar12 * auVar105._20_4_);
            bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
            local_280._24_4_ =
                 (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar105._24_4_);
            bVar12 = SUB81(uVar66 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar105._28_4_);
            auVar105 = vsubps_avx(auVar98,auVar97);
            auVar83 = vfmadd213ps_fma(auVar105,local_280,auVar97);
            uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar97._4_4_ = uVar140;
            auVar97._0_4_ = uVar140;
            auVar97._8_4_ = uVar140;
            auVar97._12_4_ = uVar140;
            auVar97._16_4_ = uVar140;
            auVar97._20_4_ = uVar140;
            auVar97._24_4_ = uVar140;
            auVar97._28_4_ = uVar140;
            auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                          CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                   CONCAT44(auVar83._4_4_ +
                                                                            auVar83._4_4_,
                                                                            auVar83._0_4_ +
                                                                            auVar83._0_4_)))),
                                       auVar97);
            uVar75 = vcmpps_avx512vl(local_240,auVar105,6);
            uVar72 = uVar72 & uVar75;
            bVar74 = (byte)uVar72;
            if (bVar74 != 0) {
              auVar162._0_4_ = auVar94._0_4_ * fVar151;
              auVar162._4_4_ = auVar94._4_4_ * fVar152;
              auVar162._8_4_ = auVar94._8_4_ * fVar153;
              auVar162._12_4_ = auVar94._12_4_ * fVar165;
              auVar162._16_4_ = auVar94._16_4_ * 0.0;
              auVar162._20_4_ = auVar94._20_4_ * 0.0;
              auVar162._24_4_ = auVar94._24_4_ * 0.0;
              auVar162._28_4_ = 0;
              auVar179._8_4_ = 0x3f800000;
              auVar179._0_8_ = 0x3f8000003f800000;
              auVar179._12_4_ = 0x3f800000;
              auVar179._16_4_ = 0x3f800000;
              auVar179._20_4_ = 0x3f800000;
              auVar179._24_4_ = 0x3f800000;
              auVar179._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar179,auVar162);
              auVar117._0_4_ =
                   (uint)(bVar65 & 1) * (int)auVar162._0_4_ |
                   (uint)!(bool)(bVar65 & 1) * auVar105._0_4_;
              bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
              auVar117._4_4_ = (uint)bVar12 * (int)auVar162._4_4_ | (uint)!bVar12 * auVar105._4_4_;
              bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
              auVar117._8_4_ = (uint)bVar12 * (int)auVar162._8_4_ | (uint)!bVar12 * auVar105._8_4_;
              bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
              auVar117._12_4_ =
                   (uint)bVar12 * (int)auVar162._12_4_ | (uint)!bVar12 * auVar105._12_4_;
              bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
              auVar117._16_4_ =
                   (uint)bVar12 * (int)auVar162._16_4_ | (uint)!bVar12 * auVar105._16_4_;
              bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
              auVar117._20_4_ =
                   (uint)bVar12 * (int)auVar162._20_4_ | (uint)!bVar12 * auVar105._20_4_;
              bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
              auVar117._24_4_ =
                   (uint)bVar12 * (int)auVar162._24_4_ | (uint)!bVar12 * auVar105._24_4_;
              auVar117._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar105._28_4_;
              auVar98._8_4_ = 0x40000000;
              auVar98._0_8_ = 0x4000000040000000;
              auVar98._12_4_ = 0x40000000;
              auVar98._16_4_ = 0x40000000;
              auVar98._20_4_ = 0x40000000;
              auVar98._24_4_ = 0x40000000;
              auVar98._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar117,auVar179,auVar98);
              local_220 = 0;
              local_21c = iVar9;
              auVar206 = ZEXT1664(local_5a0);
              local_210 = local_5a0;
              local_200 = uVar23;
              uStack_1f8 = uVar26;
              local_1f0 = uVar58;
              uStack_1e8 = uVar59;
              local_1e0 = uVar60;
              uStack_1d8 = uVar61;
              if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar157 = 1.0 / auVar99._0_4_;
                local_1c0[0] = fVar157 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar157 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar157 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar157 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar157 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar157 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar157 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                auVar146._8_4_ = 0x7f800000;
                auVar146._0_8_ = 0x7f8000007f800000;
                auVar146._12_4_ = 0x7f800000;
                auVar146._16_4_ = 0x7f800000;
                auVar146._20_4_ = 0x7f800000;
                auVar146._24_4_ = 0x7f800000;
                auVar146._28_4_ = 0x7f800000;
                auVar105 = vblendmps_avx512vl(auVar146,local_240);
                auVar118._0_4_ =
                     (uint)(bVar74 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                auVar118._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                auVar118._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
                auVar118._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
                auVar118._16_4_ = (uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
                auVar118._20_4_ = (uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                auVar118._24_4_ = (uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar72 >> 7,0);
                auVar118._28_4_ = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar105 = vshufps_avx(auVar118,auVar118,0xb1);
                auVar105 = vminps_avx(auVar118,auVar105);
                auVar106 = vshufpd_avx(auVar105,auVar105,5);
                auVar105 = vminps_avx(auVar105,auVar106);
                auVar106 = vpermpd_avx2(auVar105,0x4e);
                auVar105 = vminps_avx(auVar105,auVar106);
                uVar24 = vcmpps_avx512vl(auVar118,auVar105,0);
                uVar67 = (uint)uVar72;
                if ((bVar74 & (byte)uVar24) != 0) {
                  uVar67 = (uint)(bVar74 & (byte)uVar24);
                }
                uVar27 = 0;
                for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
                  uVar27 = uVar27 + 1;
                }
                uVar66 = (ulong)uVar27;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_460 = *(float *)(ray + k * 4 + 0x80);
                  fStack_45c = 0.0;
                  fStack_458 = 0.0;
                  fStack_454 = 0.0;
                  local_540 = auVar101;
                  local_520 = local_240;
                  do {
                    fVar157 = local_1c0[uVar66];
                    local_3e0._4_4_ = fVar157;
                    local_3e0._0_4_ = fVar157;
                    local_3e0._8_4_ = fVar157;
                    local_3e0._12_4_ = fVar157;
                    local_3d0 = *(undefined4 *)(local_1a0 + uVar66 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar66 * 4);
                    local_590.context = context->user;
                    fVar151 = 1.0 - fVar157;
                    auVar22 = vfnmadd231ss_fma(ZEXT416((uint)(fVar157 * (fVar151 + fVar151))),
                                               ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                    auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                              ZEXT416(0xc0a00000));
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * 3.0)),
                                              ZEXT416((uint)(fVar157 + fVar157)),auVar83);
                    auVar201 = ZEXT1664(auVar80);
                    auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                              ZEXT416(0x40000000));
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                              ZEXT416((uint)(fVar151 + fVar151)),auVar83);
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),local_3e0,
                                              ZEXT416((uint)(fVar151 * -2.0)));
                    fVar157 = auVar22._0_4_ * 0.5;
                    fVar151 = auVar80._0_4_ * 0.5;
                    fVar152 = auVar83._0_4_ * 0.5;
                    fVar153 = auVar82._0_4_ * 0.5;
                    auVar177._0_4_ = fVar153 * local_600;
                    auVar177._4_4_ = fVar153 * fStack_5fc;
                    auVar177._8_4_ = fVar153 * fStack_5f8;
                    auVar177._12_4_ = fVar153 * fStack_5f4;
                    auVar195._4_4_ = fVar152;
                    auVar195._0_4_ = fVar152;
                    auVar195._8_4_ = fVar152;
                    auVar195._12_4_ = fVar152;
                    auVar83 = vfmadd132ps_fma(auVar195,auVar177,auVar78);
                    auVar196 = ZEXT1664(auVar83);
                    auVar178._4_4_ = fVar151;
                    auVar178._0_4_ = fVar151;
                    auVar178._8_4_ = fVar151;
                    auVar178._12_4_ = fVar151;
                    auVar82 = vfmadd132ps_fma(auVar178,auVar83,auVar18);
                    auVar143._4_4_ = fVar157;
                    auVar143._0_4_ = fVar157;
                    auVar143._8_4_ = fVar157;
                    auVar143._12_4_ = fVar157;
                    auVar82 = vfmadd213ps_fma(auVar143,auVar206._0_16_,auVar82);
                    local_410 = auVar82._0_4_;
                    local_400 = vshufps_avx(auVar82,auVar82,0x55);
                    auVar189 = ZEXT1664(local_400);
                    local_3f0 = vshufps_avx(auVar82,auVar82,0xaa);
                    iStack_40c = local_410;
                    iStack_408 = local_410;
                    iStack_404 = local_410;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    local_3c0 = local_4c0._0_8_;
                    uStack_3b8 = local_4c0._8_8_;
                    local_3b0 = local_4b0;
                    vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                    uStack_39c = (local_590.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_590.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_5d0 = local_4d0;
                    local_590.valid = (int *)local_5d0;
                    local_590.geometryUserPtr = pGVar69->userPtr;
                    local_590.hit = (RTCHitN *)&local_410;
                    local_590.N = 4;
                    local_590.ray = (RTCRayN *)ray;
                    if (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar189 = ZEXT1664(local_400);
                      auVar196 = ZEXT1664(auVar83);
                      auVar201 = ZEXT1664(auVar80);
                      (*pGVar69->intersectionFilterN)(&local_590);
                      auVar208 = ZEXT3264(local_520);
                      auVar216 = ZEXT3264(local_540);
                      auVar217 = ZEXT3264(local_4a0);
                      auVar215 = ZEXT3264(local_480);
                      auVar206 = ZEXT1664(local_5a0);
                    }
                    uVar75 = vptestmd_avx512vl(local_5d0,local_5d0);
                    if ((uVar75 & 0xf) == 0) {
LAB_01803559:
                      *(float *)(ray + k * 4 + 0x80) = local_460;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar189 = ZEXT1664(auVar189._0_16_);
                        auVar196 = ZEXT1664(auVar196._0_16_);
                        auVar201 = ZEXT1664(auVar201._0_16_);
                        (*p_Var11)(&local_590);
                        auVar208 = ZEXT3264(local_520);
                        auVar216 = ZEXT3264(local_540);
                        auVar217 = ZEXT3264(local_4a0);
                        auVar215 = ZEXT3264(local_480);
                        auVar206 = ZEXT1664(local_5a0);
                      }
                      uVar75 = vptestmd_avx512vl(local_5d0,local_5d0);
                      uVar75 = uVar75 & 0xf;
                      bVar74 = (byte)uVar75;
                      if (bVar74 == 0) goto LAB_01803559;
                      iVar1 = *(int *)(local_590.hit + 4);
                      iVar2 = *(int *)(local_590.hit + 8);
                      iVar57 = *(int *)(local_590.hit + 0xc);
                      bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar14 = SUB81(uVar75 >> 3,0);
                      *(uint *)(local_590.ray + 0xc0) =
                           (uint)(bVar74 & 1) * *(int *)local_590.hit |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xc0);
                      *(uint *)(local_590.ray + 0xc4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xc4);
                      *(uint *)(local_590.ray + 200) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 200);
                      *(uint *)(local_590.ray + 0xcc) =
                           (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_590.ray + 0xcc);
                      iVar1 = *(int *)(local_590.hit + 0x14);
                      iVar2 = *(int *)(local_590.hit + 0x18);
                      iVar57 = *(int *)(local_590.hit + 0x1c);
                      bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar14 = SUB81(uVar75 >> 3,0);
                      *(uint *)(local_590.ray + 0xd0) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x10) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xd0);
                      *(uint *)(local_590.ray + 0xd4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xd4);
                      *(uint *)(local_590.ray + 0xd8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xd8);
                      *(uint *)(local_590.ray + 0xdc) =
                           (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_590.ray + 0xdc);
                      iVar1 = *(int *)(local_590.hit + 0x24);
                      iVar2 = *(int *)(local_590.hit + 0x28);
                      iVar57 = *(int *)(local_590.hit + 0x2c);
                      bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar14 = SUB81(uVar75 >> 3,0);
                      *(uint *)(local_590.ray + 0xe0) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x20) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xe0);
                      *(uint *)(local_590.ray + 0xe4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xe4);
                      *(uint *)(local_590.ray + 0xe8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xe8);
                      *(uint *)(local_590.ray + 0xec) =
                           (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_590.ray + 0xec);
                      iVar1 = *(int *)(local_590.hit + 0x34);
                      iVar2 = *(int *)(local_590.hit + 0x38);
                      iVar57 = *(int *)(local_590.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar14 = SUB81(uVar75 >> 3,0);
                      *(uint *)(local_590.ray + 0xf0) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x30) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xf0);
                      *(uint *)(local_590.ray + 0xf4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xf4);
                      *(uint *)(local_590.ray + 0xf8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xf8);
                      *(uint *)(local_590.ray + 0xfc) =
                           (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_590.ray + 0xfc);
                      iVar1 = *(int *)(local_590.hit + 0x44);
                      iVar2 = *(int *)(local_590.hit + 0x48);
                      iVar57 = *(int *)(local_590.hit + 0x4c);
                      bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                      bVar14 = SUB81(uVar75 >> 3,0);
                      *(uint *)(local_590.ray + 0x100) =
                           (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x40) |
                           (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0x100);
                      *(uint *)(local_590.ray + 0x104) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0x104);
                      *(uint *)(local_590.ray + 0x108) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0x108);
                      *(uint *)(local_590.ray + 0x10c) =
                           (uint)bVar14 * iVar57 | (uint)!bVar14 * *(int *)(local_590.ray + 0x10c);
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                      *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar83;
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                      *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                      *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                      *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar83;
                      local_460 = *(float *)(ray + k * 4 + 0x80);
                      fStack_45c = 0.0;
                      fStack_458 = 0.0;
                      fStack_454 = 0.0;
                    }
                    auVar101 = auVar216._0_32_;
                    bVar74 = ~(byte)(1 << ((uint)uVar66 & 0x1f)) & (byte)uVar72;
                    auVar150._4_4_ = local_460;
                    auVar150._0_4_ = local_460;
                    auVar150._8_4_ = local_460;
                    auVar150._12_4_ = local_460;
                    auVar150._16_4_ = local_460;
                    auVar150._20_4_ = local_460;
                    auVar150._24_4_ = local_460;
                    auVar150._28_4_ = local_460;
                    uVar24 = vcmpps_avx512vl(auVar208._0_32_,auVar150,2);
                    if ((bVar74 & (byte)uVar24) == 0) goto LAB_01802450;
                    bVar74 = bVar74 & (byte)uVar24;
                    uVar72 = (ulong)bVar74;
                    auVar101._8_4_ = 0x7f800000;
                    auVar101._0_8_ = 0x7f8000007f800000;
                    auVar101._12_4_ = 0x7f800000;
                    auVar101._16_4_ = 0x7f800000;
                    auVar101._20_4_ = 0x7f800000;
                    auVar101._24_4_ = 0x7f800000;
                    auVar101._28_4_ = 0x7f800000;
                    auVar101 = vblendmps_avx512vl(auVar101,auVar208._0_32_);
                    auVar131._0_4_ =
                         (uint)(bVar74 & 1) * auVar101._0_4_ |
                         (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar74 >> 1 & 1);
                    auVar131._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar74 >> 2 & 1);
                    auVar131._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar74 >> 3 & 1);
                    auVar131._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar74 >> 4 & 1);
                    auVar131._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar74 >> 5 & 1);
                    auVar131._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar74 >> 6 & 1);
                    auVar131._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar131._28_4_ =
                         (uint)(bVar74 >> 7) * auVar101._28_4_ |
                         (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
                    auVar101 = vshufps_avx(auVar131,auVar131,0xb1);
                    auVar101 = vminps_avx(auVar131,auVar101);
                    auVar105 = vshufpd_avx(auVar101,auVar101,5);
                    auVar101 = vminps_avx(auVar101,auVar105);
                    auVar105 = vpermpd_avx2(auVar101,0x4e);
                    auVar101 = vminps_avx(auVar101,auVar105);
                    uVar24 = vcmpps_avx512vl(auVar131,auVar101,0);
                    bVar65 = (byte)uVar24 & bVar74;
                    if (bVar65 != 0) {
                      bVar74 = bVar65;
                    }
                    uVar73 = 0;
                    for (uVar67 = (uint)bVar74; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000
                        ) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar66 = (ulong)uVar73;
                  } while( true );
                }
                fVar157 = local_1c0[uVar66];
                uVar140 = *(undefined4 *)(local_1a0 + uVar66 * 4);
                fVar151 = 1.0 - fVar157;
                auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar157 * (fVar151 + fVar151))),
                                           ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                auVar78 = ZEXT416((uint)fVar157);
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar78,ZEXT416(0xc0a00000)
                                         );
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * 3.0)),
                                          ZEXT416((uint)(fVar157 + fVar157)),auVar83);
                auVar201 = ZEXT1664(auVar82);
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar78,ZEXT416(0x40000000)
                                         );
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                          ZEXT416((uint)(fVar151 + fVar151)),auVar83);
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),auVar78,
                                          ZEXT416((uint)(fVar151 * -2.0)));
                fVar151 = auVar18._0_4_ * 0.5;
                fVar152 = auVar82._0_4_ * 0.5;
                auVar189 = ZEXT464((uint)fVar152);
                fVar153 = auVar83._0_4_ * 0.5;
                fVar165 = auVar78._0_4_ * 0.5;
                auVar171._0_4_ = fVar165 * local_600;
                auVar171._4_4_ = fVar165 * fStack_5fc;
                auVar171._8_4_ = fVar165 * fStack_5f8;
                auVar171._12_4_ = fVar165 * fStack_5f4;
                auVar192._4_4_ = fVar153;
                auVar192._0_4_ = fVar153;
                auVar192._8_4_ = fVar153;
                auVar192._12_4_ = fVar153;
                auVar83 = vfmadd132ps_fma(auVar192,auVar171,*pauVar4);
                auVar196 = ZEXT1664(auVar83);
                auVar172._4_4_ = fVar152;
                auVar172._0_4_ = fVar152;
                auVar172._8_4_ = fVar152;
                auVar172._12_4_ = fVar152;
                auVar83 = vfmadd132ps_fma(auVar172,auVar83,*pauVar3);
                auVar160._4_4_ = fVar151;
                auVar160._0_4_ = fVar151;
                auVar160._8_4_ = fVar151;
                auVar160._12_4_ = fVar151;
                auVar83 = vfmadd213ps_fma(auVar160,local_5a0,auVar83);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar66 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                uVar10 = vextractps_avx(auVar83,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                uVar10 = vextractps_avx(auVar83,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                *(float *)(ray + k * 4 + 0xf0) = fVar157;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar140;
                *(uint *)(ray + k * 4 + 0x110) = uVar73;
                *(uint *)(ray + k * 4 + 0x120) = uVar8;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_01802450:
                pre = local_5b8;
                prim = local_5b0;
                fVar157 = (float)local_560._0_4_;
              }
            }
          }
        }
      }
    }
    local_560._0_4_ = fVar157;
    if (8 < iVar9) {
      auVar105 = vpbroadcastd_avx512vl();
      auVar216 = ZEXT3264(auVar105);
      local_460 = (float)local_560._0_4_;
      fStack_45c = (float)local_560._0_4_;
      fStack_458 = (float)local_560._0_4_;
      fStack_454 = (float)local_560._0_4_;
      fStack_450 = (float)local_560._0_4_;
      fStack_44c = (float)local_560._0_4_;
      fStack_448 = (float)local_560._0_4_;
      fStack_444 = (float)local_560._0_4_;
      uStack_43c = local_440;
      uStack_438 = local_440;
      uStack_434 = local_440;
      uStack_430 = local_440;
      uStack_42c = local_440;
      uStack_428 = local_440;
      uStack_424 = local_440;
      local_100 = 1.0 / (float)local_500._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar68 = 8;
      local_540 = auVar101;
LAB_018024f0:
      if (lVar68 < iVar9) {
        auVar101 = vpbroadcastd_avx512vl();
        auVar101 = vpor_avx2(auVar101,_DAT_01fb4ba0);
        uVar25 = vpcmpgtd_avx512vl(auVar216._0_32_,auVar101);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar68 * 4 + lVar70);
        auVar105 = *(undefined1 (*) [32])(lVar70 + 0x22047f0 + lVar68 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar70 + 0x2204c74 + lVar68 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar70 + 0x22050f8 + lVar68 * 4);
        auVar208._0_4_ = auVar104._0_4_ * (float)local_360._0_4_;
        auVar208._4_4_ = auVar104._4_4_ * (float)local_360._4_4_;
        auVar208._8_4_ = auVar104._8_4_ * fStack_358;
        auVar208._12_4_ = auVar104._12_4_ * fStack_354;
        auVar208._16_4_ = auVar104._16_4_ * fStack_350;
        auVar208._20_4_ = auVar104._20_4_ * fStack_34c;
        auVar208._28_36_ = auVar196._28_36_;
        auVar208._24_4_ = auVar104._24_4_ * fStack_348;
        auVar196._0_4_ = auVar104._0_4_ * (float)local_380._0_4_;
        auVar196._4_4_ = auVar104._4_4_ * (float)local_380._4_4_;
        auVar196._8_4_ = auVar104._8_4_ * fStack_378;
        auVar196._12_4_ = auVar104._12_4_ * fStack_374;
        auVar196._16_4_ = auVar104._16_4_ * fStack_370;
        auVar196._20_4_ = auVar104._20_4_ * fStack_36c;
        auVar196._28_36_ = auVar189._28_36_;
        auVar196._24_4_ = auVar104._24_4_ * fStack_368;
        auVar103 = vmulps_avx512vl(local_e0,auVar104);
        local_480 = auVar215._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar106,local_320);
        auVar90 = vfmadd231ps_avx512vl(auVar196._0_32_,auVar106,local_340);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar105,local_2e0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar105,local_300);
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar105,local_a0);
        auVar83 = vfmadd231ps_fma(auVar89,auVar101,local_2a0);
        auVar196 = ZEXT1664(auVar83);
        auVar82 = vfmadd231ps_fma(auVar90,auVar101,local_2c0);
        auVar189 = ZEXT1664(auVar82);
        auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar68 * 4 + lVar70);
        auVar89 = *(undefined1 (*) [32])(lVar70 + 0x2206c10 + lVar68 * 4);
        auVar93 = vfmadd231ps_avx512vl(auVar102,auVar101,local_80);
        auVar90 = *(undefined1 (*) [32])(lVar70 + 0x2207094 + lVar68 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar70 + 0x2207518 + lVar68 * 4);
        auVar215._0_4_ = auVar102._0_4_ * (float)local_360._0_4_;
        auVar215._4_4_ = auVar102._4_4_ * (float)local_360._4_4_;
        auVar215._8_4_ = auVar102._8_4_ * fStack_358;
        auVar215._12_4_ = auVar102._12_4_ * fStack_354;
        auVar215._16_4_ = auVar102._16_4_ * fStack_350;
        auVar215._20_4_ = auVar102._20_4_ * fStack_34c;
        auVar215._28_36_ = auVar201._28_36_;
        auVar215._24_4_ = auVar102._24_4_ * fStack_348;
        auVar40._4_4_ = auVar102._4_4_ * (float)local_380._4_4_;
        auVar40._0_4_ = auVar102._0_4_ * (float)local_380._0_4_;
        auVar40._8_4_ = auVar102._8_4_ * fStack_378;
        auVar40._12_4_ = auVar102._12_4_ * fStack_374;
        auVar40._16_4_ = auVar102._16_4_ * fStack_370;
        auVar40._20_4_ = auVar102._20_4_ * fStack_36c;
        auVar40._24_4_ = auVar102._24_4_ * fStack_368;
        auVar40._28_4_ = uStack_364;
        auVar91 = vmulps_avx512vl(local_e0,auVar102);
        auVar92 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar90,local_320);
        auVar215 = ZEXT3264(local_480);
        auVar94 = vfmadd231ps_avx512vl(auVar40,auVar90,local_340);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar90,local_c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_2e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,local_300);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_a0);
        auVar78 = vfmadd231ps_fma(auVar92,auVar103,local_2a0);
        auVar201 = ZEXT1664(auVar78);
        auVar18 = vfmadd231ps_fma(auVar94,auVar103,local_2c0);
        auVar94 = vfmadd231ps_avx512vl(auVar91,auVar103,local_80);
        auVar95 = vmaxps_avx512vl(auVar93,auVar94);
        auVar91 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar83));
        auVar92 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar82));
        auVar96 = vmulps_avx512vl(ZEXT1632(auVar82),auVar91);
        auVar97 = vmulps_avx512vl(ZEXT1632(auVar83),auVar92);
        auVar96 = vsubps_avx512vl(auVar96,auVar97);
        auVar97 = vmulps_avx512vl(auVar92,auVar92);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,auVar91);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        auVar95 = vmulps_avx512vl(auVar95,auVar97);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        uVar24 = vcmpps_avx512vl(auVar96,auVar95,2);
        bVar74 = (byte)uVar25 & (byte)uVar24;
        if (bVar74 != 0) {
          auVar102 = vmulps_avx512vl(local_140,auVar102);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_540,auVar102);
          local_4a0 = auVar217._0_32_;
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_4a0,auVar90);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_480,auVar89);
          auVar104 = vmulps_avx512vl(local_140,auVar104);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_540,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_4a0,auVar106);
          auVar89 = vfmadd213ps_avx512vl(auVar101,local_480,auVar105);
          auVar101 = *(undefined1 (*) [32])(lVar70 + 0x220557c + lVar68 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar70 + 0x2205a00 + lVar68 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar70 + 0x2205e84 + lVar68 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar70 + 0x2206308 + lVar68 * 4);
          auVar90 = vmulps_avx512vl(_local_360,auVar104);
          auVar102 = vmulps_avx512vl(_local_380,auVar104);
          auVar104 = vmulps_avx512vl(local_140,auVar104);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar106,local_320);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_340);
          auVar80 = vfmadd231ps_fma(auVar104,auVar106,local_540);
          auVar106 = vfmadd231ps_avx512vl(auVar90,auVar105,local_2e0);
          auVar104 = vfmadd231ps_avx512vl(auVar102,auVar105,local_300);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),local_4a0,auVar105);
          auVar90 = vfmadd231ps_avx512vl(auVar106,auVar101,local_2a0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_2c0);
          auVar102 = vfmadd231ps_avx512vl(auVar105,local_480,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar70 + 0x220799c + lVar68 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar70 + 0x22082a4 + lVar68 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar70 + 0x2208728 + lVar68 * 4);
          auVar95 = vmulps_avx512vl(_local_360,auVar106);
          auVar96 = vmulps_avx512vl(_local_380,auVar106);
          auVar106 = vmulps_avx512vl(local_140,auVar106);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar105,local_320);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_340);
          auVar106 = vfmadd231ps_avx512vl(auVar106,local_540,auVar105);
          auVar105 = *(undefined1 (*) [32])(lVar70 + 0x2207e20 + lVar68 * 4);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar105,local_2e0);
          auVar215 = ZEXT3264(local_480);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_300);
          auVar105 = vfmadd231ps_avx512vl(auVar106,local_4a0,auVar105);
          auVar106 = vfmadd231ps_avx512vl(auVar95,auVar101,local_2a0);
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar101,local_2c0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_480,auVar101);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar90,auVar96);
          vandps_avx512vl(auVar104,auVar96);
          auVar101 = vmaxps_avx(auVar96,auVar96);
          vandps_avx512vl(auVar102,auVar96);
          auVar101 = vmaxps_avx(auVar101,auVar96);
          auVar63._4_4_ = fStack_45c;
          auVar63._0_4_ = local_460;
          auVar63._8_4_ = fStack_458;
          auVar63._12_4_ = fStack_454;
          auVar63._16_4_ = fStack_450;
          auVar63._20_4_ = fStack_44c;
          auVar63._24_4_ = fStack_448;
          auVar63._28_4_ = fStack_444;
          uVar66 = vcmpps_avx512vl(auVar101,auVar63,1);
          bVar12 = (bool)((byte)uVar66 & 1);
          auVar119._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar90._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar90._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar90._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar90._12_4_);
          bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar90._16_4_);
          bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar90._20_4_);
          bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar90._24_4_);
          bVar12 = SUB81(uVar66 >> 7,0);
          auVar119._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar90._28_4_;
          bVar12 = (bool)((byte)uVar66 & 1);
          auVar120._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar104._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar104._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar104._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar104._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar104._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar104._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar104._24_4_)
          ;
          bVar12 = SUB81(uVar66 >> 7,0);
          auVar120._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar104._28_4_;
          vandps_avx512vl(auVar106,auVar96);
          vandps_avx512vl(auVar95,auVar96);
          auVar101 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(auVar105,auVar96);
          auVar101 = vmaxps_avx(auVar101,auVar120);
          uVar66 = vcmpps_avx512vl(auVar101,auVar63,1);
          bVar12 = (bool)((byte)uVar66 & 1);
          auVar121._0_4_ = (uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar106._0_4_;
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar106._4_4_;
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar106._8_4_;
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar106._12_4_;
          bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar106._16_4_;
          bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar106._20_4_;
          bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar106._24_4_;
          bVar12 = SUB81(uVar66 >> 7,0);
          auVar121._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar106._28_4_;
          bVar12 = (bool)((byte)uVar66 & 1);
          auVar122._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar95._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar95._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar95._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar95._12_4_);
          bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar95._16_4_);
          bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar95._20_4_);
          bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar95._24_4_);
          bVar12 = SUB81(uVar66 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar95._28_4_;
          auVar205._8_4_ = 0x80000000;
          auVar205._0_8_ = 0x8000000080000000;
          auVar205._12_4_ = 0x80000000;
          auVar205._16_4_ = 0x80000000;
          auVar205._20_4_ = 0x80000000;
          auVar205._24_4_ = 0x80000000;
          auVar205._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar121,auVar205);
          auVar88 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
          auVar105 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar88));
          auVar80 = vfmadd231ps_fma(auVar105,auVar120,auVar120);
          auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
          auVar214._8_4_ = 0xbf000000;
          auVar214._0_8_ = 0xbf000000bf000000;
          auVar214._12_4_ = 0xbf000000;
          auVar214._16_4_ = 0xbf000000;
          auVar214._20_4_ = 0xbf000000;
          auVar214._24_4_ = 0xbf000000;
          auVar214._28_4_ = 0xbf000000;
          fVar157 = auVar105._0_4_;
          fVar151 = auVar105._4_4_;
          fVar152 = auVar105._8_4_;
          fVar153 = auVar105._12_4_;
          fVar165 = auVar105._16_4_;
          fVar164 = auVar105._20_4_;
          fVar182 = auVar105._24_4_;
          auVar41._4_4_ = fVar151 * fVar151 * fVar151 * auVar80._4_4_ * -0.5;
          auVar41._0_4_ = fVar157 * fVar157 * fVar157 * auVar80._0_4_ * -0.5;
          auVar41._8_4_ = fVar152 * fVar152 * fVar152 * auVar80._8_4_ * -0.5;
          auVar41._12_4_ = fVar153 * fVar153 * fVar153 * auVar80._12_4_ * -0.5;
          auVar41._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar41._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar41._24_4_ = fVar182 * fVar182 * fVar182 * -0.0;
          auVar41._28_4_ = auVar120._28_4_;
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar105 = vfmadd231ps_avx512vl(auVar41,auVar106,auVar105);
          auVar42._4_4_ = auVar120._4_4_ * auVar105._4_4_;
          auVar42._0_4_ = auVar120._0_4_ * auVar105._0_4_;
          auVar42._8_4_ = auVar120._8_4_ * auVar105._8_4_;
          auVar42._12_4_ = auVar120._12_4_ * auVar105._12_4_;
          auVar42._16_4_ = auVar120._16_4_ * auVar105._16_4_;
          auVar42._20_4_ = auVar120._20_4_ * auVar105._20_4_;
          auVar42._24_4_ = auVar120._24_4_ * auVar105._24_4_;
          auVar42._28_4_ = 0;
          auVar43._4_4_ = auVar105._4_4_ * -auVar119._4_4_;
          auVar43._0_4_ = auVar105._0_4_ * -auVar119._0_4_;
          auVar43._8_4_ = auVar105._8_4_ * -auVar119._8_4_;
          auVar43._12_4_ = auVar105._12_4_ * -auVar119._12_4_;
          auVar43._16_4_ = auVar105._16_4_ * -auVar119._16_4_;
          auVar43._20_4_ = auVar105._20_4_ * -auVar119._20_4_;
          auVar43._24_4_ = auVar105._24_4_ * -auVar119._24_4_;
          auVar43._28_4_ = auVar120._28_4_;
          auVar104 = vmulps_avx512vl(auVar105,ZEXT1632(auVar88));
          auVar102 = ZEXT1632(auVar88);
          auVar105 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar102);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar122,auVar122);
          auVar90 = vrsqrt14ps_avx512vl(auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar214);
          fVar157 = auVar90._0_4_;
          fVar151 = auVar90._4_4_;
          fVar152 = auVar90._8_4_;
          fVar153 = auVar90._12_4_;
          fVar165 = auVar90._16_4_;
          fVar164 = auVar90._20_4_;
          fVar182 = auVar90._24_4_;
          auVar44._4_4_ = fVar151 * fVar151 * fVar151 * auVar105._4_4_;
          auVar44._0_4_ = fVar157 * fVar157 * fVar157 * auVar105._0_4_;
          auVar44._8_4_ = fVar152 * fVar152 * fVar152 * auVar105._8_4_;
          auVar44._12_4_ = fVar153 * fVar153 * fVar153 * auVar105._12_4_;
          auVar44._16_4_ = fVar165 * fVar165 * fVar165 * auVar105._16_4_;
          auVar44._20_4_ = fVar164 * fVar164 * fVar164 * auVar105._20_4_;
          auVar44._24_4_ = fVar182 * fVar182 * fVar182 * auVar105._24_4_;
          auVar44._28_4_ = auVar105._28_4_;
          auVar105 = vfmadd231ps_avx512vl(auVar44,auVar106,auVar90);
          auVar45._4_4_ = auVar122._4_4_ * auVar105._4_4_;
          auVar45._0_4_ = auVar122._0_4_ * auVar105._0_4_;
          auVar45._8_4_ = auVar122._8_4_ * auVar105._8_4_;
          auVar45._12_4_ = auVar122._12_4_ * auVar105._12_4_;
          auVar45._16_4_ = auVar122._16_4_ * auVar105._16_4_;
          auVar45._20_4_ = auVar122._20_4_ * auVar105._20_4_;
          auVar45._24_4_ = auVar122._24_4_ * auVar105._24_4_;
          auVar45._28_4_ = auVar90._28_4_;
          auVar46._4_4_ = auVar105._4_4_ * auVar101._4_4_;
          auVar46._0_4_ = auVar105._0_4_ * auVar101._0_4_;
          auVar46._8_4_ = auVar105._8_4_ * auVar101._8_4_;
          auVar46._12_4_ = auVar105._12_4_ * auVar101._12_4_;
          auVar46._16_4_ = auVar105._16_4_ * auVar101._16_4_;
          auVar46._20_4_ = auVar105._20_4_ * auVar101._20_4_;
          auVar46._24_4_ = auVar105._24_4_ * auVar101._24_4_;
          auVar46._28_4_ = auVar101._28_4_;
          auVar101 = vmulps_avx512vl(auVar105,auVar102);
          auVar80 = vfmadd213ps_fma(auVar42,auVar93,ZEXT1632(auVar83));
          auVar22 = vfmadd213ps_fma(auVar43,auVar93,ZEXT1632(auVar82));
          auVar106 = vfmadd213ps_avx512vl(auVar104,auVar93,auVar89);
          auVar90 = vfmadd213ps_avx512vl(auVar45,auVar94,ZEXT1632(auVar78));
          auVar84 = vfnmadd213ps_fma(auVar42,auVar93,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar46,auVar94,ZEXT1632(auVar18));
          auVar81 = vfnmadd213ps_fma(auVar43,auVar93,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar101,auVar94,auVar103);
          auVar86 = vfnmadd231ps_fma(auVar89,auVar93,auVar104);
          auVar141 = vfnmadd213ps_fma(auVar45,auVar94,ZEXT1632(auVar78));
          auVar85 = vfnmadd213ps_fma(auVar46,auVar94,ZEXT1632(auVar18));
          auVar154 = vfnmadd231ps_fma(auVar103,auVar94,auVar101);
          auVar103 = vsubps_avx512vl(auVar90,ZEXT1632(auVar84));
          auVar101 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar81));
          auVar105 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar86));
          auVar47._4_4_ = auVar101._4_4_ * auVar86._4_4_;
          auVar47._0_4_ = auVar101._0_4_ * auVar86._0_4_;
          auVar47._8_4_ = auVar101._8_4_ * auVar86._8_4_;
          auVar47._12_4_ = auVar101._12_4_ * auVar86._12_4_;
          auVar47._16_4_ = auVar101._16_4_ * 0.0;
          auVar47._20_4_ = auVar101._20_4_ * 0.0;
          auVar47._24_4_ = auVar101._24_4_ * 0.0;
          auVar47._28_4_ = auVar104._28_4_;
          auVar78 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar81),auVar105);
          auVar48._4_4_ = auVar105._4_4_ * auVar84._4_4_;
          auVar48._0_4_ = auVar105._0_4_ * auVar84._0_4_;
          auVar48._8_4_ = auVar105._8_4_ * auVar84._8_4_;
          auVar48._12_4_ = auVar105._12_4_ * auVar84._12_4_;
          auVar48._16_4_ = auVar105._16_4_ * 0.0;
          auVar48._20_4_ = auVar105._20_4_ * 0.0;
          auVar48._24_4_ = auVar105._24_4_ * 0.0;
          auVar48._28_4_ = auVar105._28_4_;
          auVar18 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar86),auVar103);
          auVar49._4_4_ = auVar81._4_4_ * auVar103._4_4_;
          auVar49._0_4_ = auVar81._0_4_ * auVar103._0_4_;
          auVar49._8_4_ = auVar81._8_4_ * auVar103._8_4_;
          auVar49._12_4_ = auVar81._12_4_ * auVar103._12_4_;
          auVar49._16_4_ = auVar103._16_4_ * 0.0;
          auVar49._20_4_ = auVar103._20_4_ * 0.0;
          auVar49._24_4_ = auVar103._24_4_ * 0.0;
          auVar49._28_4_ = auVar103._28_4_;
          auVar87 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar84),auVar101);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar102,ZEXT1632(auVar18));
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,ZEXT1632(auVar78));
          auVar96 = ZEXT1632(auVar88);
          uVar66 = vcmpps_avx512vl(auVar101,auVar96,2);
          bVar65 = (byte)uVar66;
          fVar132 = (float)((uint)(bVar65 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar65 & 1) * auVar141._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          fVar134 = (float)((uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar141._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          fVar136 = (float)((uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar141._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          fVar138 = (float)((uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar141._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
          fVar133 = (float)((uint)(bVar65 & 1) * auVar22._0_4_ |
                           (uint)!(bool)(bVar65 & 1) * auVar85._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          fVar135 = (float)((uint)bVar12 * auVar22._4_4_ | (uint)!bVar12 * auVar85._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          fVar137 = (float)((uint)bVar12 * auVar22._8_4_ | (uint)!bVar12 * auVar85._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          fVar139 = (float)((uint)bVar12 * auVar22._12_4_ | (uint)!bVar12 * auVar85._12_4_);
          auVar91 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar133))));
          auVar123._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar154._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar154._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar154._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar154._12_4_);
          fVar152 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar106._16_4_);
          auVar123._16_4_ = fVar152;
          fVar157 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar106._20_4_);
          auVar123._20_4_ = fVar157;
          fVar151 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar106._24_4_);
          auVar123._24_4_ = fVar151;
          iVar1 = (uint)(byte)(uVar66 >> 7) * auVar106._28_4_;
          auVar123._28_4_ = iVar1;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar90);
          auVar124._0_4_ =
               (uint)(bVar65 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar78._0_4_;
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar78._4_4_;
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar78._8_4_;
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar78._12_4_;
          auVar124._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar101._16_4_;
          auVar124._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar101._20_4_;
          auVar124._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar101._24_4_;
          auVar124._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar83));
          auVar125._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar80._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar80._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar80._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar80._12_4_)
          ;
          fVar153 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar101._16_4_);
          auVar125._16_4_ = fVar153;
          fVar165 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar101._20_4_);
          auVar125._20_4_ = fVar165;
          fVar164 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar101._24_4_);
          auVar125._24_4_ = fVar164;
          auVar125._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar82));
          auVar126._0_4_ =
               (float)((uint)(bVar65 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar65 & 1) * auVar22._0_4_);
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar22._4_4_);
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar22._8_4_);
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar22._12_4_)
          ;
          fVar182 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar101._16_4_);
          auVar126._16_4_ = fVar182;
          fVar76 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar101._20_4_);
          auVar126._20_4_ = fVar76;
          fVar77 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar101._24_4_);
          auVar126._24_4_ = fVar77;
          iVar2 = (uint)(byte)(uVar66 >> 7) * auVar101._28_4_;
          auVar126._28_4_ = iVar2;
          auVar127._0_4_ =
               (uint)(bVar65 & 1) * (int)auVar84._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar90._0_4_;
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar12 * (int)auVar84._4_4_ | (uint)!bVar12 * auVar90._4_4_;
          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar12 * (int)auVar84._8_4_ | (uint)!bVar12 * auVar90._8_4_;
          bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar12 * (int)auVar84._12_4_ | (uint)!bVar12 * auVar90._12_4_;
          auVar127._16_4_ = (uint)!(bool)((byte)(uVar66 >> 4) & 1) * auVar90._16_4_;
          auVar127._20_4_ = (uint)!(bool)((byte)(uVar66 >> 5) & 1) * auVar90._20_4_;
          auVar127._24_4_ = (uint)!(bool)((byte)(uVar66 >> 6) & 1) * auVar90._24_4_;
          auVar127._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar90._28_4_;
          bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar66 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar66 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar90 = vsubps_avx512vl(auVar127,auVar102);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar81._12_4_ |
                                                   (uint)!bVar16 * auVar83._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar81._8_4_ |
                                                            (uint)!bVar14 * auVar83._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar81._4_4_ |
                                                                     (uint)!bVar12 * auVar83._4_4_,
                                                                     (uint)(bVar65 & 1) *
                                                                     (int)auVar81._0_4_ |
                                                                     (uint)!(bool)(bVar65 & 1) *
                                                                     auVar83._0_4_)))),auVar91);
          auVar196 = ZEXT3264(auVar105);
          auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar86._12_4_ |
                                                   (uint)!bVar17 * auVar82._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar86._8_4_ |
                                                            (uint)!bVar15 * auVar82._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar86._4_4_ |
                                                                     (uint)!bVar13 * auVar82._4_4_,
                                                                     (uint)(bVar65 & 1) *
                                                                     (int)auVar86._0_4_ |
                                                                     (uint)!(bool)(bVar65 & 1) *
                                                                     auVar82._0_4_)))),auVar123);
          auVar104 = vsubps_avx(auVar102,auVar124);
          auVar201 = ZEXT3264(auVar104);
          auVar103 = vsubps_avx(auVar91,auVar125);
          auVar89 = vsubps_avx(auVar123,auVar126);
          auVar50._4_4_ = auVar106._4_4_ * fVar134;
          auVar50._0_4_ = auVar106._0_4_ * fVar132;
          auVar50._8_4_ = auVar106._8_4_ * fVar136;
          auVar50._12_4_ = auVar106._12_4_ * fVar138;
          auVar50._16_4_ = auVar106._16_4_ * 0.0;
          auVar50._20_4_ = auVar106._20_4_ * 0.0;
          auVar50._24_4_ = auVar106._24_4_ * 0.0;
          auVar50._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar50,auVar123,auVar90);
          auVar180._0_4_ = fVar133 * auVar90._0_4_;
          auVar180._4_4_ = fVar135 * auVar90._4_4_;
          auVar180._8_4_ = fVar137 * auVar90._8_4_;
          auVar180._12_4_ = fVar139 * auVar90._12_4_;
          auVar180._16_4_ = auVar90._16_4_ * 0.0;
          auVar180._20_4_ = auVar90._20_4_ * 0.0;
          auVar180._24_4_ = auVar90._24_4_ * 0.0;
          auVar180._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar180,auVar102,auVar105);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar96,ZEXT1632(auVar83));
          auVar187._0_4_ = auVar105._0_4_ * auVar123._0_4_;
          auVar187._4_4_ = auVar105._4_4_ * auVar123._4_4_;
          auVar187._8_4_ = auVar105._8_4_ * auVar123._8_4_;
          auVar187._12_4_ = auVar105._12_4_ * auVar123._12_4_;
          auVar187._16_4_ = auVar105._16_4_ * fVar152;
          auVar187._20_4_ = auVar105._20_4_ * fVar157;
          auVar187._24_4_ = auVar105._24_4_ * fVar151;
          auVar187._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar187,auVar91,auVar106);
          auVar92 = vfmadd231ps_avx512vl(auVar101,auVar96,ZEXT1632(auVar83));
          auVar101 = vmulps_avx512vl(auVar89,auVar124);
          auVar101 = vfmsub231ps_avx512vl(auVar101,auVar104,auVar126);
          auVar51._4_4_ = auVar103._4_4_ * auVar126._4_4_;
          auVar51._0_4_ = auVar103._0_4_ * auVar126._0_4_;
          auVar51._8_4_ = auVar103._8_4_ * auVar126._8_4_;
          auVar51._12_4_ = auVar103._12_4_ * auVar126._12_4_;
          auVar51._16_4_ = auVar103._16_4_ * fVar182;
          auVar51._20_4_ = auVar103._20_4_ * fVar76;
          auVar51._24_4_ = auVar103._24_4_ * fVar77;
          auVar51._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar51,auVar125,auVar89);
          auVar188._0_4_ = auVar125._0_4_ * auVar104._0_4_;
          auVar188._4_4_ = auVar125._4_4_ * auVar104._4_4_;
          auVar188._8_4_ = auVar125._8_4_ * auVar104._8_4_;
          auVar188._12_4_ = auVar125._12_4_ * auVar104._12_4_;
          auVar188._16_4_ = fVar153 * auVar104._16_4_;
          auVar188._20_4_ = fVar165 * auVar104._20_4_;
          auVar188._24_4_ = fVar164 * auVar104._24_4_;
          auVar188._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar188,auVar103,auVar124);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar96,auVar101);
          auVar95 = vfmadd231ps_avx512vl(auVar101,auVar96,ZEXT1632(auVar83));
          auVar189 = ZEXT3264(auVar95);
          auVar101 = vmaxps_avx(auVar92,auVar95);
          uVar24 = vcmpps_avx512vl(auVar101,auVar96,2);
          bVar74 = bVar74 & (byte)uVar24;
          if (bVar74 != 0) {
            auVar52._4_4_ = auVar89._4_4_ * auVar105._4_4_;
            auVar52._0_4_ = auVar89._0_4_ * auVar105._0_4_;
            auVar52._8_4_ = auVar89._8_4_ * auVar105._8_4_;
            auVar52._12_4_ = auVar89._12_4_ * auVar105._12_4_;
            auVar52._16_4_ = auVar89._16_4_ * auVar105._16_4_;
            auVar52._20_4_ = auVar89._20_4_ * auVar105._20_4_;
            auVar52._24_4_ = auVar89._24_4_ * auVar105._24_4_;
            auVar52._28_4_ = auVar101._28_4_;
            auVar18 = vfmsub231ps_fma(auVar52,auVar103,auVar106);
            auVar53._4_4_ = auVar106._4_4_ * auVar104._4_4_;
            auVar53._0_4_ = auVar106._0_4_ * auVar104._0_4_;
            auVar53._8_4_ = auVar106._8_4_ * auVar104._8_4_;
            auVar53._12_4_ = auVar106._12_4_ * auVar104._12_4_;
            auVar53._16_4_ = auVar106._16_4_ * auVar104._16_4_;
            auVar53._20_4_ = auVar106._20_4_ * auVar104._20_4_;
            auVar53._24_4_ = auVar106._24_4_ * auVar104._24_4_;
            auVar53._28_4_ = auVar106._28_4_;
            auVar78 = vfmsub231ps_fma(auVar53,auVar90,auVar89);
            auVar54._4_4_ = auVar103._4_4_ * auVar90._4_4_;
            auVar54._0_4_ = auVar103._0_4_ * auVar90._0_4_;
            auVar54._8_4_ = auVar103._8_4_ * auVar90._8_4_;
            auVar54._12_4_ = auVar103._12_4_ * auVar90._12_4_;
            auVar54._16_4_ = auVar103._16_4_ * auVar90._16_4_;
            auVar54._20_4_ = auVar103._20_4_ * auVar90._20_4_;
            auVar54._24_4_ = auVar103._24_4_ * auVar90._24_4_;
            auVar54._28_4_ = auVar103._28_4_;
            auVar80 = vfmsub231ps_fma(auVar54,auVar104,auVar105);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar78),ZEXT1632(auVar80));
            auVar82 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar18),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar101 = vrcp14ps_avx512vl(ZEXT1632(auVar82));
            auVar201 = ZEXT3264(auVar101);
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar105 = vfnmadd213ps_avx512vl(auVar101,ZEXT1632(auVar82),auVar31);
            auVar83 = vfmadd132ps_fma(auVar105,auVar101,auVar101);
            auVar196 = ZEXT1664(auVar83);
            auVar55._4_4_ = auVar80._4_4_ * auVar123._4_4_;
            auVar55._0_4_ = auVar80._0_4_ * auVar123._0_4_;
            auVar55._8_4_ = auVar80._8_4_ * auVar123._8_4_;
            auVar55._12_4_ = auVar80._12_4_ * auVar123._12_4_;
            auVar55._16_4_ = fVar152 * 0.0;
            auVar55._20_4_ = fVar157 * 0.0;
            auVar55._24_4_ = fVar151 * 0.0;
            auVar55._28_4_ = iVar1;
            auVar78 = vfmadd231ps_fma(auVar55,auVar91,ZEXT1632(auVar78));
            auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar102,ZEXT1632(auVar18));
            fVar157 = auVar83._0_4_;
            fVar151 = auVar83._4_4_;
            fVar152 = auVar83._8_4_;
            fVar153 = auVar83._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar78._12_4_ * fVar153,
                                           CONCAT48(auVar78._8_4_ * fVar152,
                                                    CONCAT44(auVar78._4_4_ * fVar151,
                                                             auVar78._0_4_ * fVar157))));
            auVar208 = ZEXT3264(local_240);
            auVar64._4_4_ = uStack_43c;
            auVar64._0_4_ = local_440;
            auVar64._8_4_ = uStack_438;
            auVar64._12_4_ = uStack_434;
            auVar64._16_4_ = uStack_430;
            auVar64._20_4_ = uStack_42c;
            auVar64._24_4_ = uStack_428;
            auVar64._28_4_ = uStack_424;
            uVar24 = vcmpps_avx512vl(local_240,auVar64,0xd);
            uVar140 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar32._4_4_ = uVar140;
            auVar32._0_4_ = uVar140;
            auVar32._8_4_ = uVar140;
            auVar32._12_4_ = uVar140;
            auVar32._16_4_ = uVar140;
            auVar32._20_4_ = uVar140;
            auVar32._24_4_ = uVar140;
            auVar32._28_4_ = uVar140;
            uVar25 = vcmpps_avx512vl(local_240,auVar32,2);
            bVar74 = (byte)uVar24 & (byte)uVar25 & bVar74;
            if (bVar74 != 0) {
              uVar72 = vcmpps_avx512vl(ZEXT1632(auVar82),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar72 = bVar74 & uVar72;
              if ((char)uVar72 != '\0') {
                fVar165 = auVar92._0_4_ * fVar157;
                fVar164 = auVar92._4_4_ * fVar151;
                auVar56._4_4_ = fVar164;
                auVar56._0_4_ = fVar165;
                fVar182 = auVar92._8_4_ * fVar152;
                auVar56._8_4_ = fVar182;
                fVar76 = auVar92._12_4_ * fVar153;
                auVar56._12_4_ = fVar76;
                fVar77 = auVar92._16_4_ * 0.0;
                auVar56._16_4_ = fVar77;
                fVar132 = auVar92._20_4_ * 0.0;
                auVar56._20_4_ = fVar132;
                fVar133 = auVar92._24_4_ * 0.0;
                auVar56._24_4_ = fVar133;
                auVar56._28_4_ = auVar92._28_4_;
                auVar163._8_4_ = 0x3f800000;
                auVar163._0_8_ = 0x3f8000003f800000;
                auVar163._12_4_ = 0x3f800000;
                auVar163._16_4_ = 0x3f800000;
                auVar163._20_4_ = 0x3f800000;
                auVar163._24_4_ = 0x3f800000;
                auVar163._28_4_ = 0x3f800000;
                auVar101 = vsubps_avx(auVar163,auVar56);
                local_280._0_4_ =
                     (float)((uint)(bVar65 & 1) * (int)fVar165 |
                            (uint)!(bool)(bVar65 & 1) * auVar101._0_4_);
                bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar12 * (int)fVar164 | (uint)!bVar12 * auVar101._4_4_);
                bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar12 * (int)fVar182 | (uint)!bVar12 * auVar101._8_4_);
                bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar12 * (int)fVar76 | (uint)!bVar12 * auVar101._12_4_);
                bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar12 * (int)fVar77 | (uint)!bVar12 * auVar101._16_4_);
                bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar12 * (int)fVar132 | (uint)!bVar12 * auVar101._20_4_);
                bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar12 * (int)fVar133 | (uint)!bVar12 * auVar101._24_4_);
                bVar12 = SUB81(uVar66 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar101._28_4_);
                auVar101 = vsubps_avx(auVar94,auVar93);
                auVar83 = vfmadd213ps_fma(auVar101,local_280,auVar93);
                uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                auVar33._4_4_ = uVar140;
                auVar33._0_4_ = uVar140;
                auVar33._8_4_ = uVar140;
                auVar33._12_4_ = uVar140;
                auVar33._16_4_ = uVar140;
                auVar33._20_4_ = uVar140;
                auVar33._24_4_ = uVar140;
                auVar33._28_4_ = uVar140;
                auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                              CONCAT48(auVar83._8_4_ + auVar83._8_4_
                                                                       ,CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                           auVar33);
                uVar75 = vcmpps_avx512vl(local_240,auVar101,6);
                uVar72 = uVar72 & uVar75;
                bVar74 = (byte)uVar72;
                if (bVar74 != 0) {
                  auVar156._0_4_ = auVar95._0_4_ * fVar157;
                  auVar156._4_4_ = auVar95._4_4_ * fVar151;
                  auVar156._8_4_ = auVar95._8_4_ * fVar152;
                  auVar156._12_4_ = auVar95._12_4_ * fVar153;
                  auVar156._16_4_ = auVar95._16_4_ * 0.0;
                  auVar156._20_4_ = auVar95._20_4_ * 0.0;
                  auVar156._24_4_ = auVar95._24_4_ * 0.0;
                  auVar156._28_4_ = 0;
                  auVar181._8_4_ = 0x3f800000;
                  auVar181._0_8_ = 0x3f8000003f800000;
                  auVar181._12_4_ = 0x3f800000;
                  auVar181._16_4_ = 0x3f800000;
                  auVar181._20_4_ = 0x3f800000;
                  auVar181._24_4_ = 0x3f800000;
                  auVar181._28_4_ = 0x3f800000;
                  auVar101 = vsubps_avx(auVar181,auVar156);
                  auVar128._0_4_ =
                       (uint)(bVar65 & 1) * (int)auVar156._0_4_ |
                       (uint)!(bool)(bVar65 & 1) * auVar101._0_4_;
                  bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                  auVar128._4_4_ =
                       (uint)bVar12 * (int)auVar156._4_4_ | (uint)!bVar12 * auVar101._4_4_;
                  bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                  auVar128._8_4_ =
                       (uint)bVar12 * (int)auVar156._8_4_ | (uint)!bVar12 * auVar101._8_4_;
                  bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                  auVar128._12_4_ =
                       (uint)bVar12 * (int)auVar156._12_4_ | (uint)!bVar12 * auVar101._12_4_;
                  bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                  auVar128._16_4_ =
                       (uint)bVar12 * (int)auVar156._16_4_ | (uint)!bVar12 * auVar101._16_4_;
                  bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                  auVar128._20_4_ =
                       (uint)bVar12 * (int)auVar156._20_4_ | (uint)!bVar12 * auVar101._20_4_;
                  bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                  auVar128._24_4_ =
                       (uint)bVar12 * (int)auVar156._24_4_ | (uint)!bVar12 * auVar101._24_4_;
                  auVar128._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar101._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar128,auVar181,auVar34);
                  local_220 = (int)lVar68;
                  local_21c = iVar9;
                  auVar206 = ZEXT1664(local_5a0);
                  local_210 = local_5a0;
                  local_200 = uVar23;
                  uStack_1f8 = uVar26;
                  local_1f0 = uVar58;
                  uStack_1e8 = uVar59;
                  local_1e0 = uVar60;
                  uStack_1d8 = uVar61;
                  pGVar69 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    uVar73 = (uint)uVar72;
                    auVar83 = vcvtsi2ss_avx512f(auVar88,(int)lVar68);
                    fVar157 = auVar83._0_4_;
                    local_1c0[0] = (fVar157 + local_280._0_4_ + 0.0) * local_100;
                    local_1c0[1] = (fVar157 + local_280._4_4_ + 1.0) * fStack_fc;
                    local_1c0[2] = (fVar157 + local_280._8_4_ + 2.0) * fStack_f8;
                    local_1c0[3] = (fVar157 + local_280._12_4_ + 3.0) * fStack_f4;
                    fStack_1b0 = (fVar157 + local_280._16_4_ + 4.0) * fStack_f0;
                    fStack_1ac = (fVar157 + local_280._20_4_ + 5.0) * fStack_ec;
                    fStack_1a8 = (fVar157 + local_280._24_4_ + 6.0) * fStack_e8;
                    fStack_1a4 = fVar157 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    auVar147._8_4_ = 0x7f800000;
                    auVar147._0_8_ = 0x7f8000007f800000;
                    auVar147._12_4_ = 0x7f800000;
                    auVar147._16_4_ = 0x7f800000;
                    auVar147._20_4_ = 0x7f800000;
                    auVar147._24_4_ = 0x7f800000;
                    auVar147._28_4_ = 0x7f800000;
                    auVar101 = vblendmps_avx512vl(auVar147,local_240);
                    auVar129._0_4_ =
                         (uint)(bVar74 & 1) * auVar101._0_4_ |
                         (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar129._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar129._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar129._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar129._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar129._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar129._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar72 >> 7,0);
                    auVar129._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar101 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar101 = vminps_avx(auVar129,auVar101);
                    auVar105 = vshufpd_avx(auVar101,auVar101,5);
                    auVar101 = vminps_avx(auVar101,auVar105);
                    auVar105 = vpermpd_avx2(auVar101,0x4e);
                    auVar101 = vminps_avx(auVar101,auVar105);
                    uVar24 = vcmpps_avx512vl(auVar129,auVar101,0);
                    if ((bVar74 & (byte)uVar24) != 0) {
                      uVar73 = (uint)(bVar74 & (byte)uVar24);
                    }
                    uVar67 = 0;
                    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                      uVar67 = uVar67 + 1;
                    }
                    uVar66 = (ulong)uVar67;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = vmovdqa64_avx512vl(auVar216._0_32_);
                      local_560 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      local_520._0_8_ = pGVar69;
                      local_500 = local_240;
                      do {
                        fVar157 = local_1c0[uVar66];
                        local_3e0._4_4_ = fVar157;
                        local_3e0._0_4_ = fVar157;
                        local_3e0._8_4_ = fVar157;
                        local_3e0._12_4_ = fVar157;
                        local_3d0 = *(undefined4 *)(local_1a0 + uVar66 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + uVar66 * 4);
                        local_590.context = context->user;
                        fVar151 = 1.0 - fVar157;
                        auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar157 * (fVar151 + fVar151))),
                                                   ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                        auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                                  ZEXT416(0xc0a00000));
                        auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * 3.0)),
                                                  ZEXT416((uint)(fVar157 + fVar157)),auVar83);
                        auVar201 = ZEXT1664(auVar78);
                        auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                                  ZEXT416(0x40000000));
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                                  ZEXT416((uint)(fVar151 + fVar151)),auVar83);
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),local_3e0,
                                                  ZEXT416((uint)(fVar151 * -2.0)));
                        fVar157 = auVar18._0_4_ * 0.5;
                        fVar151 = auVar78._0_4_ * 0.5;
                        fVar152 = auVar83._0_4_ * 0.5;
                        fVar153 = auVar82._0_4_ * 0.5;
                        auVar175._0_4_ = fVar153 * local_600;
                        auVar175._4_4_ = fVar153 * fStack_5fc;
                        auVar175._8_4_ = fVar153 * fStack_5f8;
                        auVar175._12_4_ = fVar153 * fStack_5f4;
                        auVar194._4_4_ = fVar152;
                        auVar194._0_4_ = fVar152;
                        auVar194._8_4_ = fVar152;
                        auVar194._12_4_ = fVar152;
                        auVar83 = vfmadd132ps_fma(auVar194,auVar175,auVar20);
                        auVar196 = ZEXT1664(auVar83);
                        auVar176._4_4_ = fVar151;
                        auVar176._0_4_ = fVar151;
                        auVar176._8_4_ = fVar151;
                        auVar176._12_4_ = fVar151;
                        auVar82 = vfmadd132ps_fma(auVar176,auVar83,auVar21);
                        auVar142._4_4_ = fVar157;
                        auVar142._0_4_ = fVar157;
                        auVar142._8_4_ = fVar157;
                        auVar142._12_4_ = fVar157;
                        auVar82 = vfmadd213ps_fma(auVar142,auVar206._0_16_,auVar82);
                        local_410 = auVar82._0_4_;
                        local_400 = vshufps_avx(auVar82,auVar82,0x55);
                        auVar189 = ZEXT1664(local_400);
                        local_3f0 = vshufps_avx(auVar82,auVar82,0xaa);
                        iStack_40c = local_410;
                        iStack_408 = local_410;
                        iStack_404 = local_410;
                        uStack_3cc = local_3d0;
                        uStack_3c8 = local_3d0;
                        uStack_3c4 = local_3d0;
                        local_3c0 = local_4c0._0_8_;
                        uStack_3b8 = local_4c0._8_8_;
                        local_3b0 = local_4b0;
                        vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                        uStack_39c = (local_590.context)->instID[0];
                        local_3a0 = uStack_39c;
                        uStack_398 = uStack_39c;
                        uStack_394 = uStack_39c;
                        uStack_390 = (local_590.context)->instPrimID[0];
                        uStack_38c = uStack_390;
                        uStack_388 = uStack_390;
                        uStack_384 = uStack_390;
                        local_5d0 = local_4d0;
                        local_590.valid = (int *)local_5d0;
                        local_590.geometryUserPtr = pGVar69->userPtr;
                        local_590.hit = (RTCHitN *)&local_410;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        if (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar189 = ZEXT1664(local_400);
                          auVar196 = ZEXT1664(auVar83);
                          auVar201 = ZEXT1664(auVar78);
                          (*pGVar69->intersectionFilterN)(&local_590);
                          auVar208 = ZEXT3264(local_500);
                          auVar206 = ZEXT1664(local_5a0);
                          pGVar69 = (Geometry *)local_520._0_8_;
                        }
                        uVar75 = vptestmd_avx512vl(local_5d0,local_5d0);
                        if ((uVar75 & 0xf) == 0) {
LAB_01803135:
                          *(undefined4 *)(ray + k * 4 + 0x80) = local_560._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar189 = ZEXT1664(auVar189._0_16_);
                            auVar196 = ZEXT1664(auVar196._0_16_);
                            auVar201 = ZEXT1664(auVar201._0_16_);
                            (*p_Var11)(&local_590);
                            auVar208 = ZEXT3264(local_500);
                            auVar206 = ZEXT1664(local_5a0);
                            pGVar69 = (Geometry *)local_520._0_8_;
                          }
                          uVar75 = vptestmd_avx512vl(local_5d0,local_5d0);
                          uVar75 = uVar75 & 0xf;
                          bVar74 = (byte)uVar75;
                          if (bVar74 == 0) goto LAB_01803135;
                          iVar1 = *(int *)(local_590.hit + 4);
                          iVar2 = *(int *)(local_590.hit + 8);
                          iVar57 = *(int *)(local_590.hit + 0xc);
                          bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                          bVar14 = SUB81(uVar75 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar74 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xc4)
                          ;
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xcc);
                          iVar1 = *(int *)(local_590.hit + 0x14);
                          iVar2 = *(int *)(local_590.hit + 0x18);
                          iVar57 = *(int *)(local_590.hit + 0x1c);
                          bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                          bVar14 = SUB81(uVar75 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xd4)
                          ;
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xdc);
                          iVar1 = *(int *)(local_590.hit + 0x24);
                          iVar2 = *(int *)(local_590.hit + 0x28);
                          iVar57 = *(int *)(local_590.hit + 0x2c);
                          bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                          bVar14 = SUB81(uVar75 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xe4)
                          ;
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xec);
                          iVar1 = *(int *)(local_590.hit + 0x34);
                          iVar2 = *(int *)(local_590.hit + 0x38);
                          iVar57 = *(int *)(local_590.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                          bVar14 = SUB81(uVar75 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xf4)
                          ;
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xfc);
                          iVar1 = *(int *)(local_590.hit + 0x44);
                          iVar2 = *(int *)(local_590.hit + 0x48);
                          iVar57 = *(int *)(local_590.hit + 0x4c);
                          bVar12 = (bool)((byte)(uVar75 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
                          bVar14 = SUB81(uVar75 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar74 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar14 * iVar57 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0x10c);
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar83;
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar83;
                          local_560._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_560._4_4_ = 0;
                          local_560._8_4_ = 0;
                          local_560._12_4_ = 0;
                        }
                        bVar74 = ~(byte)(1 << ((uint)uVar66 & 0x1f)) & (byte)uVar72;
                        auVar148._4_4_ = local_560._0_4_;
                        auVar148._0_4_ = local_560._0_4_;
                        auVar148._8_4_ = local_560._0_4_;
                        auVar148._12_4_ = local_560._0_4_;
                        auVar148._16_4_ = local_560._0_4_;
                        auVar148._20_4_ = local_560._0_4_;
                        auVar148._24_4_ = local_560._0_4_;
                        auVar148._28_4_ = local_560._0_4_;
                        uVar24 = vcmpps_avx512vl(auVar208._0_32_,auVar148,2);
                        if ((bVar74 & (byte)uVar24) == 0) goto LAB_018031d2;
                        bVar74 = bVar74 & (byte)uVar24;
                        uVar73 = (uint)bVar74;
                        uVar72 = (ulong)uVar73;
                        auVar149._8_4_ = 0x7f800000;
                        auVar149._0_8_ = 0x7f8000007f800000;
                        auVar149._12_4_ = 0x7f800000;
                        auVar149._16_4_ = 0x7f800000;
                        auVar149._20_4_ = 0x7f800000;
                        auVar149._24_4_ = 0x7f800000;
                        auVar149._28_4_ = 0x7f800000;
                        auVar101 = vblendmps_avx512vl(auVar149,auVar208._0_32_);
                        auVar130._0_4_ =
                             (uint)(bVar74 & 1) * auVar101._0_4_ |
                             (uint)!(bool)(bVar74 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar74 >> 1 & 1);
                        auVar130._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar74 >> 2 & 1);
                        auVar130._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar74 >> 3 & 1);
                        auVar130._12_4_ =
                             (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar74 >> 4 & 1);
                        auVar130._16_4_ =
                             (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar74 >> 5 & 1);
                        auVar130._20_4_ =
                             (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar74 >> 6 & 1);
                        auVar130._24_4_ =
                             (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar130._28_4_ =
                             (uint)(bVar74 >> 7) * auVar101._28_4_ |
                             (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
                        auVar101 = vshufps_avx(auVar130,auVar130,0xb1);
                        auVar101 = vminps_avx(auVar130,auVar101);
                        auVar105 = vshufpd_avx(auVar101,auVar101,5);
                        auVar101 = vminps_avx(auVar101,auVar105);
                        auVar105 = vpermpd_avx2(auVar101,0x4e);
                        auVar101 = vminps_avx(auVar101,auVar105);
                        uVar24 = vcmpps_avx512vl(auVar130,auVar101,0);
                        bVar74 = (byte)uVar24 & bVar74;
                        if (bVar74 != 0) {
                          uVar73 = (uint)bVar74;
                        }
                        uVar67 = 0;
                        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                          uVar67 = uVar67 + 1;
                        }
                        uVar66 = (ulong)uVar67;
                      } while( true );
                    }
                    fVar157 = local_1c0[uVar66];
                    uVar140 = *(undefined4 *)(local_1a0 + uVar66 * 4);
                    fVar151 = 1.0 - fVar157;
                    auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar157 * (fVar151 + fVar151))),
                                               ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                    auVar78 = ZEXT416((uint)fVar157);
                    auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar78,
                                              ZEXT416(0xc0a00000));
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157 * 3.0)),
                                              ZEXT416((uint)(fVar157 + fVar157)),auVar83);
                    auVar201 = ZEXT1664(auVar82);
                    auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar78,
                                              ZEXT416(0x40000000));
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                              ZEXT416((uint)(fVar151 + fVar151)),auVar83);
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),auVar78,
                                              ZEXT416((uint)(fVar151 * -2.0)));
                    fVar151 = auVar18._0_4_ * 0.5;
                    fVar152 = auVar82._0_4_ * 0.5;
                    auVar189 = ZEXT464((uint)fVar152);
                    fVar153 = auVar83._0_4_ * 0.5;
                    fVar165 = auVar78._0_4_ * 0.5;
                    auVar173._0_4_ = fVar165 * local_600;
                    auVar173._4_4_ = fVar165 * fStack_5fc;
                    auVar173._8_4_ = fVar165 * fStack_5f8;
                    auVar173._12_4_ = fVar165 * fStack_5f4;
                    auVar193._4_4_ = fVar153;
                    auVar193._0_4_ = fVar153;
                    auVar193._8_4_ = fVar153;
                    auVar193._12_4_ = fVar153;
                    auVar83 = vfmadd132ps_fma(auVar193,auVar173,auVar19);
                    auVar196 = ZEXT1664(auVar83);
                    auVar174._4_4_ = fVar152;
                    auVar174._0_4_ = fVar152;
                    auVar174._8_4_ = fVar152;
                    auVar174._12_4_ = fVar152;
                    auVar83 = vfmadd132ps_fma(auVar174,auVar83,auVar79);
                    auVar161._4_4_ = fVar151;
                    auVar161._0_4_ = fVar151;
                    auVar161._8_4_ = fVar151;
                    auVar161._12_4_ = fVar151;
                    auVar83 = vfmadd213ps_fma(auVar161,local_5a0,auVar83);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar66 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                    uVar10 = vextractps_avx(auVar83,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                    uVar10 = vextractps_avx(auVar83,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                    *(float *)(ray + k * 4 + 0xf0) = fVar157;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar140;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_5a8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar8;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01802de6;
      }
    }
    uVar140 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar28._4_4_ = uVar140;
    auVar28._0_4_ = uVar140;
    auVar28._8_4_ = uVar140;
    auVar28._12_4_ = uVar140;
    uVar23 = vcmpps_avx512vl(local_150,auVar28,2);
    uVar71 = (ulong)((uint)uVar71 & (uint)uVar23);
  } while( true );
LAB_018031d2:
  auVar215 = ZEXT3264(local_480);
  auVar217 = ZEXT3264(local_4a0);
  auVar101 = vmovdqa64_avx512vl(local_120);
  auVar216 = ZEXT3264(auVar101);
  pre = local_5b8;
  prim = local_5b0;
LAB_01802de6:
  lVar68 = lVar68 + 8;
  goto LAB_018024f0;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }